

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O1

void VP8YuvToRgb32_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  byte bVar1;
  byte bVar9;
  byte bVar17;
  byte bVar25;
  byte bVar33;
  byte bVar41;
  byte bVar49;
  byte bVar57;
  byte bVar65;
  byte bVar73;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [12];
  undefined1 auVar152 [12];
  undefined1 auVar153 [12];
  undefined1 auVar154 [12];
  undefined1 auVar155 [12];
  undefined1 auVar156 [12];
  undefined1 auVar157 [12];
  undefined1 auVar158 [12];
  undefined1 auVar159 [12];
  undefined1 auVar160 [12];
  undefined1 auVar161 [12];
  undefined1 auVar162 [12];
  undefined1 auVar163 [12];
  undefined1 auVar164 [12];
  undefined1 auVar165 [12];
  undefined1 auVar166 [12];
  undefined1 auVar167 [12];
  undefined1 auVar168 [12];
  undefined1 auVar169 [12];
  undefined1 auVar170 [12];
  undefined1 auVar171 [12];
  undefined1 auVar172 [12];
  undefined1 auVar173 [12];
  undefined1 auVar174 [12];
  undefined1 auVar175 [12];
  undefined1 auVar176 [12];
  undefined1 auVar177 [12];
  undefined1 auVar178 [12];
  undefined1 auVar179 [12];
  undefined1 auVar180 [12];
  undefined1 auVar181 [12];
  undefined1 auVar182 [12];
  undefined1 auVar183 [12];
  undefined1 auVar184 [12];
  undefined1 auVar185 [12];
  undefined1 auVar186 [12];
  undefined4 uVar187;
  undefined8 uVar190;
  undefined1 auVar193 [12];
  undefined1 auVar194 [12];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  ushort uVar205;
  ushort uVar222;
  undefined4 uVar206;
  ushort uVar226;
  undefined1 auVar210 [12];
  undefined1 auVar211 [12];
  undefined1 auVar212 [12];
  ushort uVar223;
  ushort uVar224;
  ushort uVar225;
  ushort uVar227;
  undefined1 auVar217 [16];
  ushort uVar228;
  ushort uVar229;
  undefined4 uVar230;
  ushort uVar238;
  ushort uVar239;
  ushort uVar240;
  ushort uVar241;
  undefined1 auVar233 [12];
  ushort uVar242;
  ushort uVar243;
  ushort uVar244;
  undefined1 auVar245 [16];
  undefined4 uVar246;
  undefined8 uVar248;
  undefined1 auVar251 [12];
  ushort uVar258;
  undefined4 uVar259;
  ushort uVar271;
  ushort uVar272;
  ushort uVar273;
  ushort uVar274;
  undefined1 auVar263 [12];
  undefined1 auVar264 [12];
  ushort uVar275;
  ushort uVar276;
  ushort uVar277;
  ushort uVar278;
  undefined4 uVar279;
  ushort uVar291;
  ushort uVar292;
  undefined8 uVar281;
  ushort uVar293;
  ushort uVar294;
  undefined1 auVar284 [12];
  ushort uVar295;
  ushort uVar296;
  ushort uVar297;
  undefined4 uVar298;
  undefined1 auVar302 [12];
  undefined1 auVar305 [16];
  undefined4 uVar308;
  undefined8 uVar310;
  ushort uVar317;
  undefined4 uVar318;
  ushort uVar327;
  ushort uVar328;
  ushort uVar329;
  ushort uVar330;
  undefined1 auVar322 [12];
  ushort uVar331;
  ushort uVar332;
  ushort uVar333;
  undefined8 uVar334;
  undefined1 auVar335 [12];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  ushort uVar343;
  ushort uVar347;
  ushort uVar348;
  ushort uVar349;
  ushort uVar350;
  ushort uVar351;
  undefined1 auVar344 [12];
  ushort uVar352;
  ushort uVar353;
  undefined1 auVar354 [12];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar359 [12];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  char cVar40;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar46;
  char cVar47;
  char cVar48;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar54;
  char cVar55;
  char cVar56;
  char cVar58;
  char cVar59;
  char cVar60;
  char cVar61;
  char cVar62;
  char cVar63;
  char cVar64;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar70;
  char cVar71;
  char cVar72;
  char cVar74;
  undefined6 uVar188;
  undefined8 uVar189;
  undefined1 auVar191 [12];
  undefined1 auVar192 [12];
  undefined1 auVar195 [14];
  undefined1 auVar196 [14];
  undefined1 auVar197 [14];
  undefined1 auVar198 [14];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined6 uVar207;
  undefined8 uVar208;
  undefined1 auVar209 [12];
  undefined1 auVar213 [14];
  undefined1 auVar214 [14];
  undefined1 auVar215 [14];
  undefined1 auVar216 [14];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined6 uVar231;
  undefined1 auVar232 [12];
  undefined1 auVar234 [14];
  undefined1 auVar235 [14];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined6 uVar247;
  undefined1 auVar249 [12];
  undefined1 auVar250 [12];
  undefined1 auVar252 [14];
  undefined1 auVar253 [14];
  undefined1 auVar254 [14];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined6 uVar260;
  undefined8 uVar261;
  undefined1 auVar262 [12];
  undefined1 auVar265 [14];
  undefined1 auVar266 [14];
  undefined1 auVar267 [14];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined6 uVar280;
  undefined1 auVar282 [12];
  undefined1 auVar283 [12];
  undefined1 auVar285 [14];
  undefined1 auVar286 [14];
  undefined1 auVar287 [14];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined6 uVar299;
  undefined8 uVar300;
  undefined1 auVar301 [12];
  undefined1 auVar303 [14];
  undefined1 auVar304 [14];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined6 uVar309;
  undefined1 auVar311 [12];
  undefined1 auVar312 [12];
  undefined1 auVar313 [14];
  undefined1 auVar314 [14];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined6 uVar319;
  undefined8 uVar320;
  undefined1 auVar321 [12];
  undefined1 auVar323 [14];
  undefined1 auVar324 [14];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar336 [12];
  undefined1 auVar337 [14];
  undefined1 auVar338 [14];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar345 [14];
  undefined1 auVar346 [16];
  undefined1 auVar355 [14];
  undefined1 auVar358 [16];
  undefined1 auVar360 [14];
  undefined1 auVar363 [16];
  
  uVar190 = *(undefined8 *)y;
  auVar151[10] = 0;
  auVar151._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar151[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar163[9] = (char)((ulong)uVar190 >> 0x20);
  auVar163._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar163._10_2_ = auVar151._10_2_;
  auVar175._9_3_ = auVar163._9_3_;
  auVar175._0_9_ = (unkuint9)0;
  auVar128._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar175._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar128[0] = (char)((ulong)uVar190 >> 0x10);
  auVar128._11_5_ = 0;
  auVar127._1_12_ = SUB1612(auVar128 << 0x28,4);
  auVar127[0] = (char)((ulong)uVar190 >> 8);
  auVar127._13_3_ = 0;
  auVar199._1_14_ = SUB1614(auVar127 << 0x18,2);
  auVar199[0] = (char)uVar190;
  auVar199[0xf] = 0;
  uVar190 = *(undefined8 *)u;
  auVar152[10] = 0;
  auVar152._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar152[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar164[9] = (char)((ulong)uVar190 >> 0x20);
  auVar164._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar164._10_2_ = auVar152._10_2_;
  auVar176._9_3_ = auVar164._9_3_;
  auVar176._0_9_ = (unkuint9)0;
  auVar130._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar176._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar130[0] = (char)((ulong)uVar190 >> 0x10);
  auVar130._11_5_ = 0;
  auVar129._1_12_ = SUB1612(auVar130 << 0x28,4);
  auVar129[0] = (char)((ulong)uVar190 >> 8);
  auVar129._13_3_ = 0;
  auVar217._1_14_ = SUB1614(auVar129 << 0x18,2);
  auVar217[0] = (char)uVar190;
  auVar217[0xf] = 0;
  uVar190 = *(undefined8 *)v;
  auVar153[10] = 0;
  auVar153._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar153[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar165[9] = (char)((ulong)uVar190 >> 0x20);
  auVar165._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar165._10_2_ = auVar153._10_2_;
  auVar177._9_3_ = auVar165._9_3_;
  auVar177._0_9_ = (unkuint9)0;
  auVar132._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar177._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar132[0] = (char)((ulong)uVar190 >> 0x10);
  auVar132._11_5_ = 0;
  auVar131._1_12_ = SUB1612(auVar132 << 0x28,4);
  auVar131[0] = (char)((ulong)uVar190 >> 8);
  auVar131._13_3_ = 0;
  auVar305._1_14_ = SUB1614(auVar131 << 0x18,2);
  auVar305[0] = (char)uVar190;
  auVar305[0xf] = 0;
  auVar199 = pmulhuw(auVar199 << 8,_DAT_0012c8c0);
  auVar339 = pmulhuw(auVar305 << 8,_DAT_0012c8d0);
  auVar340._0_2_ = auVar339._0_2_ + auVar199._0_2_ + -0x379a;
  auVar340._2_2_ = auVar339._2_2_ + auVar199._2_2_ + -0x379a;
  auVar340._4_2_ = auVar339._4_2_ + auVar199._4_2_ + -0x379a;
  auVar340._6_2_ = auVar339._6_2_ + auVar199._6_2_ + -0x379a;
  auVar340._8_2_ = auVar339._8_2_ + auVar199._8_2_ + -0x379a;
  auVar340._10_2_ = auVar339._10_2_ + auVar199._10_2_ + -0x379a;
  auVar340._12_2_ = auVar339._12_2_ + auVar199._12_2_ + -0x379a;
  auVar340._14_2_ = auVar339._14_2_ + auVar199._14_2_ + -0x379a;
  auVar339 = pmulhuw(auVar217 << 8,_DAT_0012c8f0);
  auVar305 = pmulhuw(auVar305 << 8,_DAT_0012c900);
  auVar217 = pmulhuw(auVar217 << 8,_DAT_0012c920);
  auVar217 = paddusw(auVar217,auVar199);
  auVar200._0_2_ = (auVar199._0_2_ - (auVar305._0_2_ + auVar339._0_2_)) + 0x2204;
  auVar200._2_2_ = (auVar199._2_2_ - (auVar305._2_2_ + auVar339._2_2_)) + 0x2204;
  auVar200._4_2_ = (auVar199._4_2_ - (auVar305._4_2_ + auVar339._4_2_)) + 0x2204;
  auVar200._6_2_ = (auVar199._6_2_ - (auVar305._6_2_ + auVar339._6_2_)) + 0x2204;
  auVar200._8_2_ = (auVar199._8_2_ - (auVar305._8_2_ + auVar339._8_2_)) + 0x2204;
  auVar200._10_2_ = (auVar199._10_2_ - (auVar305._10_2_ + auVar339._10_2_)) + 0x2204;
  auVar200._12_2_ = (auVar199._12_2_ - (auVar305._12_2_ + auVar339._12_2_)) + 0x2204;
  auVar200._14_2_ = (auVar199._14_2_ - (auVar305._14_2_ + auVar339._14_2_)) + 0x2204;
  auVar217 = psubusw(auVar217,_DAT_0012c930);
  auVar305 = psraw(auVar340,6);
  auVar199 = psraw(auVar200,6);
  uVar205 = auVar217._0_2_ >> 6;
  uVar222 = auVar217._2_2_ >> 6;
  uVar223 = auVar217._4_2_ >> 6;
  uVar224 = auVar217._6_2_ >> 6;
  uVar225 = auVar217._8_2_ >> 6;
  uVar226 = auVar217._10_2_ >> 6;
  uVar227 = auVar217._12_2_ >> 6;
  uVar228 = auVar217._14_2_ >> 6;
  uVar190 = *(undefined8 *)(y + 8);
  auVar154[10] = 0;
  auVar154._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar154[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar166[9] = (char)((ulong)uVar190 >> 0x20);
  auVar166._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar166._10_2_ = auVar154._10_2_;
  auVar178._9_3_ = auVar166._9_3_;
  auVar178._0_9_ = (unkuint9)0;
  auVar134._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar178._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar134[0] = (char)((ulong)uVar190 >> 0x10);
  auVar134._11_5_ = 0;
  auVar133._1_12_ = SUB1612(auVar134 << 0x28,4);
  auVar133[0] = (char)((ulong)uVar190 >> 8);
  auVar133._13_3_ = 0;
  auVar339._1_14_ = SUB1614(auVar133 << 0x18,2);
  auVar339[0] = (char)uVar190;
  auVar339[0xf] = 0;
  uVar190 = *(undefined8 *)(u + 8);
  auVar155[10] = 0;
  auVar155._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar155[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar167[9] = (char)((ulong)uVar190 >> 0x20);
  auVar167._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar167._10_2_ = auVar155._10_2_;
  auVar179._9_3_ = auVar167._9_3_;
  auVar179._0_9_ = (unkuint9)0;
  auVar136._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar179._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar136[0] = (char)((ulong)uVar190 >> 0x10);
  auVar136._11_5_ = 0;
  auVar135._1_12_ = SUB1612(auVar136 << 0x28,4);
  auVar135[0] = (char)((ulong)uVar190 >> 8);
  auVar135._13_3_ = 0;
  auVar365._1_14_ = SUB1614(auVar135 << 0x18,2);
  auVar365[0] = (char)uVar190;
  auVar365[0xf] = 0;
  uVar190 = *(undefined8 *)(v + 8);
  auVar156[10] = 0;
  auVar156._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar156[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar168[9] = (char)((ulong)uVar190 >> 0x20);
  auVar168._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar168._10_2_ = auVar156._10_2_;
  auVar180._9_3_ = auVar168._9_3_;
  auVar180._0_9_ = (unkuint9)0;
  auVar138._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar180._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar138[0] = (char)((ulong)uVar190 >> 0x10);
  auVar138._11_5_ = 0;
  auVar137._1_12_ = SUB1612(auVar138 << 0x28,4);
  auVar137[0] = (char)((ulong)uVar190 >> 8);
  auVar137._13_3_ = 0;
  auVar364._1_14_ = SUB1614(auVar137 << 0x18,2);
  auVar364[0] = (char)uVar190;
  auVar364[0xf] = 0;
  auVar339 = pmulhuw(auVar339 << 8,_DAT_0012c8c0);
  auVar217 = pmulhuw(auVar364 << 8,_DAT_0012c8d0);
  auVar361._0_2_ = auVar217._0_2_ + auVar339._0_2_ + -0x379a;
  auVar361._2_2_ = auVar217._2_2_ + auVar339._2_2_ + -0x379a;
  auVar361._4_2_ = auVar217._4_2_ + auVar339._4_2_ + -0x379a;
  auVar361._6_2_ = auVar217._6_2_ + auVar339._6_2_ + -0x379a;
  auVar361._8_2_ = auVar217._8_2_ + auVar339._8_2_ + -0x379a;
  auVar361._10_2_ = auVar217._10_2_ + auVar339._10_2_ + -0x379a;
  auVar361._12_2_ = auVar217._12_2_ + auVar339._12_2_ + -0x379a;
  auVar361._14_2_ = auVar217._14_2_ + auVar339._14_2_ + -0x379a;
  auVar366 = pmulhuw(auVar365 << 8,_DAT_0012c8f0);
  auVar364 = pmulhuw(auVar364 << 8,_DAT_0012c900);
  auVar217 = pmulhuw(auVar365 << 8,_DAT_0012c920);
  auVar217 = paddusw(auVar217,auVar339);
  auVar356._0_2_ = (auVar339._0_2_ - (auVar364._0_2_ + auVar366._0_2_)) + 0x2204;
  auVar356._2_2_ = (auVar339._2_2_ - (auVar364._2_2_ + auVar366._2_2_)) + 0x2204;
  auVar356._4_2_ = (auVar339._4_2_ - (auVar364._4_2_ + auVar366._4_2_)) + 0x2204;
  auVar356._6_2_ = (auVar339._6_2_ - (auVar364._6_2_ + auVar366._6_2_)) + 0x2204;
  auVar356._8_2_ = (auVar339._8_2_ - (auVar364._8_2_ + auVar366._8_2_)) + 0x2204;
  auVar356._10_2_ = (auVar339._10_2_ - (auVar364._10_2_ + auVar366._10_2_)) + 0x2204;
  auVar356._12_2_ = (auVar339._12_2_ - (auVar364._12_2_ + auVar366._12_2_)) + 0x2204;
  auVar356._14_2_ = (auVar339._14_2_ - (auVar364._14_2_ + auVar366._14_2_)) + 0x2204;
  auVar217 = psubusw(auVar217,_DAT_0012c930);
  auVar339 = psraw(auVar361,6);
  sVar75 = auVar305._0_2_;
  sVar76 = auVar305._2_2_;
  bVar1 = (0 < sVar76) * (sVar76 < 0x100) * auVar305[2] - (0xff < sVar76);
  sVar76 = auVar305._4_2_;
  sVar83 = auVar305._6_2_;
  cVar2 = (0 < sVar83) * (sVar83 < 0x100) * auVar305[6] - (0xff < sVar83);
  uVar259 = CONCAT13(cVar2,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar305[4] - (0xff < sVar76),
                                    CONCAT11(bVar1,(0 < sVar75) * (sVar75 < 0x100) * auVar305[0] -
                                                   (0xff < sVar75))));
  sVar75 = auVar305._8_2_;
  sVar76 = auVar305._10_2_;
  cVar3 = (0 < sVar76) * (sVar76 < 0x100) * auVar305[10] - (0xff < sVar76);
  uVar260 = CONCAT15(cVar3,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar305[8] - (0xff < sVar75),
                                    uVar259));
  sVar75 = auVar305._12_2_;
  sVar76 = auVar305._14_2_;
  cVar4 = (0 < sVar76) * (sVar76 < 0x100) * auVar305[0xe] - (0xff < sVar76);
  uVar261 = CONCAT17(cVar4,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar305[0xc] -
                                    (0xff < sVar75),uVar260));
  sVar75 = auVar339._0_2_;
  sVar76 = auVar339._2_2_;
  cVar5 = (0 < sVar76) * (sVar76 < 0x100) * auVar339[2] - (0xff < sVar76);
  auVar335._0_10_ =
       CONCAT19(cVar5,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar339[0] - (0xff < sVar75),
                               uVar261));
  sVar75 = auVar339._4_2_;
  auVar335[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar339[4] - (0xff < sVar75);
  sVar75 = auVar339._6_2_;
  cVar6 = (0 < sVar75) * (sVar75 < 0x100) * auVar339[6] - (0xff < sVar75);
  auVar335[0xb] = cVar6;
  sVar75 = auVar339._8_2_;
  auVar337[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar339[8] - (0xff < sVar75);
  auVar337._0_12_ = auVar335;
  sVar75 = auVar339._10_2_;
  cVar7 = (0 < sVar75) * (sVar75 < 0x100) * auVar339[10] - (0xff < sVar75);
  auVar337[0xd] = cVar7;
  sVar75 = auVar339._12_2_;
  auVar341[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar339[0xc] - (0xff < sVar75);
  auVar341._0_14_ = auVar337;
  sVar75 = auVar339._14_2_;
  cVar8 = (0 < sVar75) * (sVar75 < 0x100) * auVar339[0xe] - (0xff < sVar75);
  auVar341[0xf] = cVar8;
  auVar305 = psraw(auVar356,6);
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  bVar9 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  sVar76 = auVar199._4_2_;
  sVar83 = auVar199._6_2_;
  cVar10 = (0 < sVar83) * (sVar83 < 0x100) * auVar199[6] - (0xff < sVar83);
  uVar187 = CONCAT13(cVar10,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar199[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar9,(0 < sVar75) * (sVar75 < 0x100) * auVar199[0] -
                                                     (0xff < sVar75))));
  sVar75 = auVar199._8_2_;
  sVar76 = auVar199._10_2_;
  cVar11 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[10] - (0xff < sVar76);
  uVar188 = CONCAT15(cVar11,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75)
                                     ,uVar187));
  sVar75 = auVar199._12_2_;
  sVar76 = auVar199._14_2_;
  cVar12 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[0xe] - (0xff < sVar76);
  uVar189 = CONCAT17(cVar12,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] -
                                     (0xff < sVar75),uVar188));
  sVar75 = auVar305._0_2_;
  sVar76 = auVar305._2_2_;
  cVar13 = (0 < sVar76) * (sVar76 < 0x100) * auVar305[2] - (0xff < sVar76);
  auVar191._0_10_ =
       CONCAT19(cVar13,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar305[0] - (0xff < sVar75),
                                uVar189));
  sVar75 = auVar305._4_2_;
  auVar191[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar305[4] - (0xff < sVar75);
  sVar75 = auVar305._6_2_;
  cVar14 = (0 < sVar75) * (sVar75 < 0x100) * auVar305[6] - (0xff < sVar75);
  auVar191[0xb] = cVar14;
  sVar75 = auVar305._8_2_;
  auVar195[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar305[8] - (0xff < sVar75);
  auVar195._0_12_ = auVar191;
  sVar75 = auVar305._10_2_;
  cVar15 = (0 < sVar75) * (sVar75 < 0x100) * auVar305[10] - (0xff < sVar75);
  auVar195[0xd] = cVar15;
  sVar75 = auVar305._12_2_;
  auVar201[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar305[0xc] - (0xff < sVar75);
  auVar201._0_14_ = auVar195;
  sVar75 = auVar305._14_2_;
  cVar16 = (0 < sVar75) * (sVar75 < 0x100) * auVar305[0xe] - (0xff < sVar75);
  auVar201[0xf] = cVar16;
  uVar343 = auVar217._0_2_ >> 6;
  uVar347 = auVar217._2_2_ >> 6;
  uVar348 = auVar217._4_2_ >> 6;
  uVar349 = auVar217._6_2_ >> 6;
  uVar350 = auVar217._8_2_ >> 6;
  uVar351 = auVar217._10_2_ >> 6;
  uVar352 = auVar217._12_2_ >> 6;
  uVar353 = auVar217._14_2_ >> 6;
  bVar17 = (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222);
  cVar18 = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
  uVar206 = CONCAT13(cVar18,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 -
                                     (0xff < uVar223),
                                     CONCAT11(bVar17,(uVar205 != 0) * (uVar205 < 0x100) *
                                                     (char)uVar205 - (0xff < uVar205))));
  cVar19 = (uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226);
  uVar207 = CONCAT15(cVar19,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 -
                                     (0xff < uVar225),uVar206));
  cVar20 = (uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 - (0xff < uVar228);
  uVar208 = CONCAT17(cVar20,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 -
                                     (0xff < uVar227),uVar207));
  cVar21 = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
  auVar209._0_10_ =
       CONCAT19(cVar21,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 -
                                (0xff < uVar343),uVar208));
  auVar209[10] = (uVar348 != 0) * (uVar348 < 0x100) * (char)uVar348 - (0xff < uVar348);
  cVar22 = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
  auVar209[0xb] = cVar22;
  auVar213[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
  auVar213._0_12_ = auVar209;
  cVar23 = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
  auVar213[0xd] = cVar23;
  auVar218[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
  auVar218._0_14_ = auVar213;
  cVar24 = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
  auVar218[0xf] = cVar24;
  uVar190 = *(undefined8 *)(y + 0x10);
  auVar157[10] = 0;
  auVar157._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar157[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar169[9] = (char)((ulong)uVar190 >> 0x20);
  auVar169._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar169._10_2_ = auVar157._10_2_;
  auVar181._9_3_ = auVar169._9_3_;
  auVar181._0_9_ = (unkuint9)0;
  auVar140._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar181._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar140[0] = (char)((ulong)uVar190 >> 0x10);
  auVar140._11_5_ = 0;
  auVar139._1_12_ = SUB1612(auVar140 << 0x28,4);
  auVar139[0] = (char)((ulong)uVar190 >> 8);
  auVar139._13_3_ = 0;
  auVar366._1_14_ = SUB1614(auVar139 << 0x18,2);
  auVar366[0] = (char)uVar190;
  auVar366[0xf] = 0;
  uVar190 = *(undefined8 *)(u + 0x10);
  auVar158[10] = 0;
  auVar158._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar158[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar170[9] = (char)((ulong)uVar190 >> 0x20);
  auVar170._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar170._10_2_ = auVar158._10_2_;
  auVar182._9_3_ = auVar170._9_3_;
  auVar182._0_9_ = (unkuint9)0;
  auVar142._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar182._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar142[0] = (char)((ulong)uVar190 >> 0x10);
  auVar142._11_5_ = 0;
  auVar141._1_12_ = SUB1612(auVar142 << 0x28,4);
  auVar141[0] = (char)((ulong)uVar190 >> 8);
  auVar141._13_3_ = 0;
  auVar367._1_14_ = SUB1614(auVar141 << 0x18,2);
  auVar367[0] = (char)uVar190;
  auVar367[0xf] = 0;
  uVar190 = *(undefined8 *)(v + 0x10);
  auVar159[10] = 0;
  auVar159._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar159[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar171[9] = (char)((ulong)uVar190 >> 0x20);
  auVar171._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar171._10_2_ = auVar159._10_2_;
  auVar183._9_3_ = auVar171._9_3_;
  auVar183._0_9_ = (unkuint9)0;
  auVar144._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar183._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar144[0] = (char)((ulong)uVar190 >> 0x10);
  auVar144._11_5_ = 0;
  auVar143._1_12_ = SUB1612(auVar144 << 0x28,4);
  auVar143[0] = (char)((ulong)uVar190 >> 8);
  auVar143._13_3_ = 0;
  auVar123._1_14_ = SUB1614(auVar143 << 0x18,2);
  auVar123[0] = (char)uVar190;
  auVar123[0xf] = 0;
  auVar339 = pmulhuw(auVar366 << 8,_DAT_0012c8c0);
  auVar217 = pmulhuw(auVar123 << 8,_DAT_0012c8d0);
  auVar366 = pmulhuw(auVar367 << 8,_DAT_0012c8f0);
  auVar365 = pmulhuw(auVar123 << 8,_DAT_0012c900);
  auVar199 = pmulhuw(auVar367 << 8,_DAT_0012c920);
  auVar305 = paddusw(auVar199,auVar339);
  uVar190 = *(undefined8 *)(y + 0x18);
  auVar160[10] = 0;
  auVar160._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar160[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar172[9] = (char)((ulong)uVar190 >> 0x20);
  auVar172._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar172._10_2_ = auVar160._10_2_;
  auVar184._9_3_ = auVar172._9_3_;
  auVar184._0_9_ = (unkuint9)0;
  auVar146._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar184._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar146[0] = (char)((ulong)uVar190 >> 0x10);
  auVar146._11_5_ = 0;
  auVar145._1_12_ = SUB1612(auVar146 << 0x28,4);
  auVar145[0] = (char)((ulong)uVar190 >> 8);
  auVar145._13_3_ = 0;
  auVar124._1_14_ = SUB1614(auVar145 << 0x18,2);
  auVar124[0] = (char)uVar190;
  auVar124[0xf] = 0;
  uVar190 = *(undefined8 *)(u + 0x18);
  auVar161[10] = 0;
  auVar161._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar161[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar173[9] = (char)((ulong)uVar190 >> 0x20);
  auVar173._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar173._10_2_ = auVar161._10_2_;
  auVar185._9_3_ = auVar173._9_3_;
  auVar185._0_9_ = (unkuint9)0;
  auVar148._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar185._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar148[0] = (char)((ulong)uVar190 >> 0x10);
  auVar148._11_5_ = 0;
  auVar147._1_12_ = SUB1612(auVar148 << 0x28,4);
  auVar147[0] = (char)((ulong)uVar190 >> 8);
  auVar147._13_3_ = 0;
  auVar125._1_14_ = SUB1614(auVar147 << 0x18,2);
  auVar125[0] = (char)uVar190;
  auVar125[0xf] = 0;
  uVar190 = *(undefined8 *)(v + 0x18);
  auVar162[10] = 0;
  auVar162._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar162[0xb] = (char)((ulong)uVar190 >> 0x28);
  auVar174[9] = (char)((ulong)uVar190 >> 0x20);
  auVar174._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar174._10_2_ = auVar162._10_2_;
  auVar186._9_3_ = auVar174._9_3_;
  auVar186._0_9_ = (unkuint9)0;
  auVar150._1_10_ =
       SUB1610(ZEXT516(CONCAT41(auVar186._8_4_,(char)((ulong)uVar190 >> 0x18))) << 0x38,6);
  auVar150[0] = (char)((ulong)uVar190 >> 0x10);
  auVar150._11_5_ = 0;
  auVar149._1_12_ = SUB1612(auVar150 << 0x28,4);
  auVar149[0] = (char)((ulong)uVar190 >> 8);
  auVar149._13_3_ = 0;
  auVar126._1_14_ = SUB1614(auVar149 << 0x18,2);
  auVar126[0] = (char)uVar190;
  auVar126[0xf] = 0;
  auVar367 = pmulhuw(auVar124 << 8,_DAT_0012c8c0);
  auVar357._0_2_ = auVar217._0_2_ + auVar339._0_2_ + -0x379a;
  auVar357._2_2_ = auVar217._2_2_ + auVar339._2_2_ + -0x379a;
  auVar357._4_2_ = auVar217._4_2_ + auVar339._4_2_ + -0x379a;
  auVar357._6_2_ = auVar217._6_2_ + auVar339._6_2_ + -0x379a;
  auVar357._8_2_ = auVar217._8_2_ + auVar339._8_2_ + -0x379a;
  auVar357._10_2_ = auVar217._10_2_ + auVar339._10_2_ + -0x379a;
  auVar357._12_2_ = auVar217._12_2_ + auVar339._12_2_ + -0x379a;
  auVar357._14_2_ = auVar217._14_2_ + auVar339._14_2_ + -0x379a;
  auVar199 = pmulhuw(_DAT_0012c8d0,auVar126 << 8);
  auVar245._0_2_ = auVar199._0_2_ + auVar367._0_2_ + -0x379a;
  auVar245._2_2_ = auVar199._2_2_ + auVar367._2_2_ + -0x379a;
  auVar245._4_2_ = auVar199._4_2_ + auVar367._4_2_ + -0x379a;
  auVar245._6_2_ = auVar199._6_2_ + auVar367._6_2_ + -0x379a;
  auVar245._8_2_ = auVar199._8_2_ + auVar367._8_2_ + -0x379a;
  auVar245._10_2_ = auVar199._10_2_ + auVar367._10_2_ + -0x379a;
  auVar245._12_2_ = auVar199._12_2_ + auVar367._12_2_ + -0x379a;
  auVar245._14_2_ = auVar199._14_2_ + auVar367._14_2_ + -0x379a;
  auVar199 = pmulhuw(auVar126 << 8,_DAT_0012c900);
  auVar217 = pmulhuw(_DAT_0012c8f0,auVar125 << 8);
  auVar364 = pmulhuw(auVar125 << 8,_DAT_0012c920);
  auVar364 = paddusw(auVar364,auVar367);
  auVar362._0_2_ = (auVar339._0_2_ - (auVar365._0_2_ + auVar366._0_2_)) + 0x2204;
  auVar362._2_2_ = (auVar339._2_2_ - (auVar365._2_2_ + auVar366._2_2_)) + 0x2204;
  auVar362._4_2_ = (auVar339._4_2_ - (auVar365._4_2_ + auVar366._4_2_)) + 0x2204;
  auVar362._6_2_ = (auVar339._6_2_ - (auVar365._6_2_ + auVar366._6_2_)) + 0x2204;
  auVar362._8_2_ = (auVar339._8_2_ - (auVar365._8_2_ + auVar366._8_2_)) + 0x2204;
  auVar362._10_2_ = (auVar339._10_2_ - (auVar365._10_2_ + auVar366._10_2_)) + 0x2204;
  auVar362._12_2_ = (auVar339._12_2_ - (auVar365._12_2_ + auVar366._12_2_)) + 0x2204;
  auVar362._14_2_ = (auVar339._14_2_ - (auVar365._14_2_ + auVar366._14_2_)) + 0x2204;
  auVar305 = psubusw(auVar305,_DAT_0012c930);
  auVar339 = psraw(auVar357,6);
  auVar365 = psraw(auVar362,6);
  uVar205 = auVar305._0_2_ >> 6;
  uVar222 = auVar305._2_2_ >> 6;
  uVar223 = auVar305._4_2_ >> 6;
  uVar224 = auVar305._6_2_ >> 6;
  uVar225 = auVar305._8_2_ >> 6;
  uVar226 = auVar305._10_2_ >> 6;
  uVar227 = auVar305._12_2_ >> 6;
  uVar228 = auVar305._14_2_ >> 6;
  auVar368._0_2_ = (auVar367._0_2_ - (auVar199._0_2_ + auVar217._0_2_)) + 0x2204;
  auVar368._2_2_ = (auVar367._2_2_ - (auVar199._2_2_ + auVar217._2_2_)) + 0x2204;
  auVar368._4_2_ = (auVar367._4_2_ - (auVar199._4_2_ + auVar217._4_2_)) + 0x2204;
  auVar368._6_2_ = (auVar367._6_2_ - (auVar199._6_2_ + auVar217._6_2_)) + 0x2204;
  auVar368._8_2_ = (auVar367._8_2_ - (auVar199._8_2_ + auVar217._8_2_)) + 0x2204;
  auVar368._10_2_ = (auVar367._10_2_ - (auVar199._10_2_ + auVar217._10_2_)) + 0x2204;
  auVar368._12_2_ = (auVar367._12_2_ - (auVar199._12_2_ + auVar217._12_2_)) + 0x2204;
  auVar368._14_2_ = (auVar367._14_2_ - (auVar199._14_2_ + auVar217._14_2_)) + 0x2204;
  auVar217 = psubusw(auVar364,_DAT_0012c930);
  auVar199 = psraw(auVar245,6);
  sVar75 = auVar339._0_2_;
  sVar76 = auVar339._2_2_;
  bVar25 = (0 < sVar76) * (sVar76 < 0x100) * auVar339[2] - (0xff < sVar76);
  sVar76 = auVar339._4_2_;
  sVar83 = auVar339._6_2_;
  cVar26 = (0 < sVar83) * (sVar83 < 0x100) * auVar339[6] - (0xff < sVar83);
  uVar308 = CONCAT13(cVar26,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar339[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar25,(0 < sVar75) * (sVar75 < 0x100) * auVar339[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar339._8_2_;
  sVar76 = auVar339._10_2_;
  cVar27 = (0 < sVar76) * (sVar76 < 0x100) * auVar339[10] - (0xff < sVar76);
  uVar309 = CONCAT15(cVar27,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar339[8] - (0xff < sVar75)
                                     ,uVar308));
  sVar75 = auVar339._12_2_;
  sVar76 = auVar339._14_2_;
  cVar28 = (0 < sVar76) * (sVar76 < 0x100) * auVar339[0xe] - (0xff < sVar76);
  uVar190 = CONCAT17(cVar28,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar339[0xc] -
                                     (0xff < sVar75),uVar309));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar29 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar354._0_10_ =
       CONCAT19(cVar29,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar190));
  sVar75 = auVar199._4_2_;
  auVar354[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar30 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar354[0xb] = cVar30;
  sVar75 = auVar199._8_2_;
  auVar355[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar355._0_12_ = auVar354;
  sVar75 = auVar199._10_2_;
  cVar31 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar355[0xd] = cVar31;
  sVar75 = auVar199._12_2_;
  auVar358[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar358._0_14_ = auVar355;
  sVar75 = auVar199._14_2_;
  cVar32 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar358[0xf] = cVar32;
  auVar199 = psraw(auVar368,6);
  sVar75 = auVar365._0_2_;
  sVar76 = auVar365._2_2_;
  bVar33 = (0 < sVar76) * (sVar76 < 0x100) * auVar365[2] - (0xff < sVar76);
  sVar76 = auVar365._4_2_;
  sVar83 = auVar365._6_2_;
  cVar34 = (0 < sVar83) * (sVar83 < 0x100) * auVar365[6] - (0xff < sVar83);
  uVar318 = CONCAT13(cVar34,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar365[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar33,(0 < sVar75) * (sVar75 < 0x100) * auVar365[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar365._8_2_;
  sVar76 = auVar365._10_2_;
  cVar35 = (0 < sVar76) * (sVar76 < 0x100) * auVar365[10] - (0xff < sVar76);
  uVar319 = CONCAT15(cVar35,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar365[8] - (0xff < sVar75)
                                     ,uVar318));
  sVar75 = auVar365._12_2_;
  sVar76 = auVar365._14_2_;
  cVar36 = (0 < sVar76) * (sVar76 < 0x100) * auVar365[0xe] - (0xff < sVar76);
  uVar320 = CONCAT17(cVar36,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar365[0xc] -
                                     (0xff < sVar75),uVar319));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar37 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar359._0_10_ =
       CONCAT19(cVar37,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar320));
  sVar75 = auVar199._4_2_;
  auVar359[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar38 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar359[0xb] = cVar38;
  sVar75 = auVar199._8_2_;
  auVar360[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar360._0_12_ = auVar359;
  sVar75 = auVar199._10_2_;
  cVar39 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar360[0xd] = cVar39;
  sVar75 = auVar199._12_2_;
  auVar363[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar363._0_14_ = auVar360;
  sVar75 = auVar199._14_2_;
  cVar40 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar363[0xf] = cVar40;
  uVar343 = auVar217._0_2_ >> 6;
  uVar347 = auVar217._2_2_ >> 6;
  uVar348 = auVar217._4_2_ >> 6;
  uVar349 = auVar217._6_2_ >> 6;
  uVar350 = auVar217._8_2_ >> 6;
  uVar351 = auVar217._10_2_ >> 6;
  uVar352 = auVar217._12_2_ >> 6;
  uVar353 = auVar217._14_2_ >> 6;
  bVar41 = (uVar222 != 0) * (uVar222 < 0x100) * (char)uVar222 - (0xff < uVar222);
  cVar42 = (uVar224 != 0) * (uVar224 < 0x100) * (char)uVar224 - (0xff < uVar224);
  uVar298 = CONCAT13(cVar42,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * (char)uVar223 -
                                     (0xff < uVar223),
                                     CONCAT11(bVar41,(uVar205 != 0) * (uVar205 < 0x100) *
                                                     (char)uVar205 - (0xff < uVar205))));
  cVar43 = (uVar226 != 0) * (uVar226 < 0x100) * (char)uVar226 - (0xff < uVar226);
  uVar299 = CONCAT15(cVar43,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * (char)uVar225 -
                                     (0xff < uVar225),uVar298));
  cVar44 = (uVar228 != 0) * (uVar228 < 0x100) * (char)uVar228 - (0xff < uVar228);
  uVar300 = CONCAT17(cVar44,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * (char)uVar227 -
                                     (0xff < uVar227),uVar299));
  cVar45 = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
  auVar344._0_10_ =
       CONCAT19(cVar45,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * (char)uVar343 -
                                (0xff < uVar343),uVar300));
  auVar344[10] = (uVar348 != 0) * (uVar348 < 0x100) * (char)uVar348 - (0xff < uVar348);
  cVar46 = (uVar349 != 0) * (uVar349 < 0x100) * (char)uVar349 - (0xff < uVar349);
  auVar344[0xb] = cVar46;
  auVar345[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
  auVar345._0_12_ = auVar344;
  cVar47 = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
  auVar345[0xd] = cVar47;
  auVar346[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
  auVar346._0_14_ = auVar345;
  cVar48 = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
  auVar346[0xf] = cVar48;
  auVar217 = auVar341 & _DAT_0012a6d0;
  auVar199 = auVar358 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar49 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar50 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar246 = CONCAT13(cVar50,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar49,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar51 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar247 = CONCAT15(cVar51,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar246));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar52 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar281 = CONCAT17(cVar52,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar247));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar53 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar282._0_10_ =
       CONCAT19(cVar53,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar281));
  sVar75 = auVar199._4_2_;
  auVar282[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar54 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar282[0xb] = cVar54;
  sVar75 = auVar199._8_2_;
  auVar285[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar285._0_12_ = auVar282;
  sVar75 = auVar199._10_2_;
  cVar55 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar285[0xd] = cVar55;
  sVar75 = auVar199._12_2_;
  auVar288[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar288._0_14_ = auVar285;
  sVar75 = auVar199._14_2_;
  cVar56 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar288[0xf] = cVar56;
  auVar217 = auVar201 & _DAT_0012a6d0;
  auVar199 = auVar363 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar57 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar58 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar279 = CONCAT13(cVar58,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar57,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar59 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar280 = CONCAT15(cVar59,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar279));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar60 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar310 = CONCAT17(cVar60,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar280));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar61 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar311._0_10_ =
       CONCAT19(cVar61,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar310));
  sVar75 = auVar199._4_2_;
  auVar311[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar62 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar311[0xb] = cVar62;
  sVar75 = auVar199._8_2_;
  auVar313[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar313._0_12_ = auVar311;
  sVar75 = auVar199._10_2_;
  cVar63 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar313[0xd] = cVar63;
  sVar75 = auVar199._12_2_;
  auVar315[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar315._0_14_ = auVar313;
  sVar75 = auVar199._14_2_;
  cVar64 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar315[0xf] = cVar64;
  auVar217 = auVar218 & _DAT_0012a6d0;
  auVar199 = auVar346 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar65 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar66 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar230 = CONCAT13(cVar66,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar65,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar67 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar231 = CONCAT15(cVar67,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar230));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar68 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar248 = CONCAT17(cVar68,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar231));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar69 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar249._0_10_ =
       CONCAT19(cVar69,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar248));
  sVar75 = auVar199._4_2_;
  auVar249[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar70 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar249[0xb] = cVar70;
  sVar75 = auVar199._8_2_;
  auVar252[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar252._0_12_ = auVar249;
  sVar75 = auVar199._10_2_;
  cVar71 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar252[0xd] = cVar71;
  sVar75 = auVar199._12_2_;
  auVar255[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar255._0_14_ = auVar252;
  sVar75 = auVar199._14_2_;
  cVar72 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar255[0xf] = cVar72;
  uVar205 = (ushort)bVar1;
  uVar222 = (ushort)((uint)uVar259 >> 0x18);
  uVar223 = (ushort)((uint6)uVar260 >> 0x28);
  uVar224 = (ushort)((ulong)uVar261 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar335._0_10_ >> 0x48);
  uVar226 = auVar335._10_2_ >> 8;
  uVar227 = auVar337._12_2_ >> 8;
  uVar228 = auVar341._14_2_ >> 8;
  uVar343 = (ushort)bVar25;
  uVar347 = (ushort)((uint)uVar308 >> 0x18);
  uVar348 = (ushort)((uint6)uVar309 >> 0x28);
  uVar349 = (ushort)((ulong)uVar190 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar354._0_10_ >> 0x48);
  uVar351 = auVar354._10_2_ >> 8;
  uVar352 = auVar355._12_2_ >> 8;
  uVar353 = auVar358._14_2_ >> 8;
  bVar73 = (uVar222 != 0) * (uVar222 < 0x100) * cVar2 - (0xff < uVar222);
  cVar74 = (uVar224 != 0) * (uVar224 < 0x100) * cVar4 - (0xff < uVar224);
  uVar308 = CONCAT13(cVar74,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar3 - (0xff < uVar223),
                                     CONCAT11(bVar73,(uVar205 != 0) * (uVar205 < 0x100) * bVar1 -
                                                     (0xff < uVar205))));
  cVar2 = (uVar226 != 0) * (uVar226 < 0x100) * cVar6 - (0xff < uVar226);
  uVar309 = CONCAT15(cVar2,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar5 - (0xff < uVar225),
                                    uVar308));
  cVar8 = (uVar228 != 0) * (uVar228 < 0x100) * cVar8 - (0xff < uVar228);
  uVar334 = CONCAT17(cVar8,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar7 - (0xff < uVar227),
                                    uVar309));
  cVar6 = (uVar347 != 0) * (uVar347 < 0x100) * cVar26 - (0xff < uVar347);
  auVar336._0_10_ =
       CONCAT19(cVar6,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar25 - (0xff < uVar343),
                               uVar334));
  auVar336[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar27 - (0xff < uVar348);
  cVar5 = (uVar349 != 0) * (uVar349 < 0x100) * cVar28 - (0xff < uVar349);
  auVar336[0xb] = cVar5;
  auVar338[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar29 - (0xff < uVar350);
  auVar338._0_12_ = auVar336;
  cVar3 = (uVar351 != 0) * (uVar351 < 0x100) * cVar30 - (0xff < uVar351);
  auVar338[0xd] = cVar3;
  auVar342[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar31 - (0xff < uVar352);
  auVar342._0_14_ = auVar338;
  cVar4 = (uVar353 != 0) * (uVar353 < 0x100) * cVar32 - (0xff < uVar353);
  auVar342[0xf] = cVar4;
  uVar205 = (ushort)bVar9;
  uVar222 = (ushort)((uint)uVar187 >> 0x18);
  uVar223 = (ushort)((uint6)uVar188 >> 0x28);
  uVar224 = (ushort)((ulong)uVar189 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar191._0_10_ >> 0x48);
  uVar226 = auVar191._10_2_ >> 8;
  uVar227 = auVar195._12_2_ >> 8;
  uVar228 = auVar201._14_2_ >> 8;
  uVar343 = (ushort)bVar33;
  uVar347 = (ushort)((uint)uVar318 >> 0x18);
  uVar348 = (ushort)((uint6)uVar319 >> 0x28);
  uVar349 = (ushort)((ulong)uVar320 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar359._0_10_ >> 0x48);
  uVar351 = auVar359._10_2_ >> 8;
  uVar352 = auVar360._12_2_ >> 8;
  uVar353 = auVar363._14_2_ >> 8;
  bVar1 = (uVar222 != 0) * (uVar222 < 0x100) * cVar10 - (0xff < uVar222);
  cVar7 = (uVar224 != 0) * (uVar224 < 0x100) * cVar12 - (0xff < uVar224);
  uVar187 = CONCAT13(cVar7,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar11 - (0xff < uVar223),
                                    CONCAT11(bVar1,(uVar205 != 0) * (uVar205 < 0x100) * bVar9 -
                                                   (0xff < uVar205))));
  cVar14 = (uVar226 != 0) * (uVar226 < 0x100) * cVar14 - (0xff < uVar226);
  uVar188 = CONCAT15(cVar14,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar13 - (0xff < uVar225),
                                     uVar187));
  cVar16 = (uVar228 != 0) * (uVar228 < 0x100) * cVar16 - (0xff < uVar228);
  uVar190 = CONCAT17(cVar16,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar15 - (0xff < uVar227),
                                     uVar188));
  cVar15 = (uVar347 != 0) * (uVar347 < 0x100) * cVar34 - (0xff < uVar347);
  auVar192._0_10_ =
       CONCAT19(cVar15,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar33 - (0xff < uVar343),
                                uVar190));
  auVar192[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar35 - (0xff < uVar348);
  cVar13 = (uVar349 != 0) * (uVar349 < 0x100) * cVar36 - (0xff < uVar349);
  auVar192[0xb] = cVar13;
  auVar196[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar37 - (0xff < uVar350);
  auVar196._0_12_ = auVar192;
  cVar12 = (uVar351 != 0) * (uVar351 < 0x100) * cVar38 - (0xff < uVar351);
  auVar196[0xd] = cVar12;
  auVar202[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar39 - (0xff < uVar352);
  auVar202._0_14_ = auVar196;
  cVar11 = (uVar353 != 0) * (uVar353 < 0x100) * cVar40 - (0xff < uVar353);
  auVar202[0xf] = cVar11;
  uVar205 = (ushort)bVar17;
  uVar222 = (ushort)((uint)uVar206 >> 0x18);
  uVar223 = (ushort)((uint6)uVar207 >> 0x28);
  uVar224 = (ushort)((ulong)uVar208 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar209._0_10_ >> 0x48);
  uVar226 = auVar209._10_2_ >> 8;
  uVar227 = auVar213._12_2_ >> 8;
  uVar228 = auVar218._14_2_ >> 8;
  uVar343 = (ushort)bVar41;
  uVar347 = (ushort)((uint)uVar298 >> 0x18);
  uVar348 = (ushort)((uint6)uVar299 >> 0x28);
  uVar349 = (ushort)((ulong)uVar300 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar344._0_10_ >> 0x48);
  uVar351 = auVar344._10_2_ >> 8;
  uVar352 = auVar345._12_2_ >> 8;
  uVar353 = auVar346._14_2_ >> 8;
  bVar9 = (uVar222 != 0) * (uVar222 < 0x100) * cVar18 - (0xff < uVar222);
  cVar31 = (uVar224 != 0) * (uVar224 < 0x100) * cVar20 - (0xff < uVar224);
  uVar206 = CONCAT13(cVar31,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar19 - (0xff < uVar223),
                                     CONCAT11(bVar9,(uVar205 != 0) * (uVar205 < 0x100) * bVar17 -
                                                    (0xff < uVar205))));
  cVar22 = (uVar226 != 0) * (uVar226 < 0x100) * cVar22 - (0xff < uVar226);
  uVar207 = CONCAT15(cVar22,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar21 - (0xff < uVar225),
                                     uVar206));
  cVar21 = (uVar228 != 0) * (uVar228 < 0x100) * cVar24 - (0xff < uVar228);
  uVar189 = CONCAT17(cVar21,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar23 - (0xff < uVar227),
                                     uVar207));
  cVar20 = (uVar347 != 0) * (uVar347 < 0x100) * cVar42 - (0xff < uVar347);
  auVar210._0_10_ =
       CONCAT19(cVar20,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar41 - (0xff < uVar343),
                                uVar189));
  auVar210[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar43 - (0xff < uVar348);
  cVar19 = (uVar349 != 0) * (uVar349 < 0x100) * cVar44 - (0xff < uVar349);
  auVar210[0xb] = cVar19;
  auVar214[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar45 - (0xff < uVar350);
  auVar214._0_12_ = auVar210;
  cVar18 = (uVar351 != 0) * (uVar351 < 0x100) * cVar46 - (0xff < uVar351);
  auVar214[0xd] = cVar18;
  auVar219[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar47 - (0xff < uVar352);
  auVar219._0_14_ = auVar214;
  cVar10 = (uVar353 != 0) * (uVar353 < 0x100) * cVar48 - (0xff < uVar353);
  auVar219[0xf] = cVar10;
  auVar217 = auVar288 & _DAT_0012a6d0;
  auVar199 = auVar315 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar17 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar23 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar298 = CONCAT13(cVar23,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar17,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar24 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar299 = CONCAT15(cVar24,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar298));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar32 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar300 = CONCAT17(cVar32,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar299));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar30 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar301._0_10_ =
       CONCAT19(cVar30,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar300));
  sVar75 = auVar199._4_2_;
  auVar301[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar28 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar301[0xb] = cVar28;
  sVar75 = auVar199._8_2_;
  auVar303[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar303._0_12_ = auVar301;
  sVar75 = auVar199._10_2_;
  cVar26 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar303[0xd] = cVar26;
  sVar75 = auVar199._12_2_;
  auVar306[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar306._0_14_ = auVar303;
  sVar75 = auVar199._14_2_;
  cVar27 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar306[0xf] = cVar27;
  auVar217 = auVar255 & _DAT_0012a6d0;
  auVar199 = auVar342 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar25 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar39 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar318 = CONCAT13(cVar39,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar25,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar38 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar319 = CONCAT15(cVar38,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar318));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar37 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar320 = CONCAT17(cVar37,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar319));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar36 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar321._0_10_ =
       CONCAT19(cVar36,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar320));
  sVar75 = auVar199._4_2_;
  auVar321[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar29 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar321[0xb] = cVar29;
  sVar75 = auVar199._8_2_;
  auVar323[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar323._0_12_ = auVar321;
  sVar75 = auVar199._10_2_;
  cVar35 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar323[0xd] = cVar35;
  sVar75 = auVar199._12_2_;
  auVar325[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar325._0_14_ = auVar323;
  sVar75 = auVar199._14_2_;
  cVar34 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar325[0xf] = cVar34;
  auVar217 = auVar202 & _DAT_0012a6d0;
  auVar199 = auVar219 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar33 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar40 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar259 = CONCAT13(cVar40,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar33,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar45 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar260 = CONCAT15(cVar45,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar259));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar48 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar261 = CONCAT17(cVar48,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar260));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar47 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar262._0_10_ =
       CONCAT19(cVar47,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar261));
  sVar75 = auVar199._4_2_;
  auVar262[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar46 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar262[0xb] = cVar46;
  sVar75 = auVar199._8_2_;
  auVar265[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar265._0_12_ = auVar262;
  sVar75 = auVar199._10_2_;
  cVar44 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar265[0xd] = cVar44;
  sVar75 = auVar199._12_2_;
  auVar268[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar268._0_14_ = auVar265;
  sVar75 = auVar199._14_2_;
  cVar43 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar268[0xf] = cVar43;
  uVar205 = (ushort)bVar49;
  uVar222 = (ushort)((uint)uVar246 >> 0x18);
  uVar223 = (ushort)((uint6)uVar247 >> 0x28);
  uVar224 = (ushort)((ulong)uVar281 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar282._0_10_ >> 0x48);
  uVar226 = auVar282._10_2_ >> 8;
  uVar227 = auVar285._12_2_ >> 8;
  uVar228 = auVar288._14_2_ >> 8;
  uVar343 = (ushort)bVar57;
  uVar347 = (ushort)((uint)uVar279 >> 0x18);
  uVar348 = (ushort)((uint6)uVar280 >> 0x28);
  uVar349 = (ushort)((ulong)uVar310 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar311._0_10_ >> 0x48);
  uVar351 = auVar311._10_2_ >> 8;
  uVar352 = auVar313._12_2_ >> 8;
  uVar353 = auVar315._14_2_ >> 8;
  bVar41 = (uVar222 != 0) * (uVar222 < 0x100) * cVar50 - (0xff < uVar222);
  cVar42 = (uVar224 != 0) * (uVar224 < 0x100) * cVar52 - (0xff < uVar224);
  uVar279 = CONCAT13(cVar42,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar51 - (0xff < uVar223),
                                     CONCAT11(bVar41,(uVar205 != 0) * (uVar205 < 0x100) * bVar49 -
                                                     (0xff < uVar205))));
  cVar54 = (uVar226 != 0) * (uVar226 < 0x100) * cVar54 - (0xff < uVar226);
  uVar280 = CONCAT15(cVar54,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar53 - (0xff < uVar225),
                                     uVar279));
  cVar53 = (uVar228 != 0) * (uVar228 < 0x100) * cVar56 - (0xff < uVar228);
  uVar281 = CONCAT17(cVar53,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar55 - (0xff < uVar227),
                                     uVar280));
  cVar55 = (uVar347 != 0) * (uVar347 < 0x100) * cVar58 - (0xff < uVar347);
  auVar283._0_10_ =
       CONCAT19(cVar55,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar57 - (0xff < uVar343),
                                uVar281));
  auVar283[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar59 - (0xff < uVar348);
  cVar52 = (uVar349 != 0) * (uVar349 < 0x100) * cVar60 - (0xff < uVar349);
  auVar283[0xb] = cVar52;
  auVar286[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar61 - (0xff < uVar350);
  auVar286._0_12_ = auVar283;
  cVar51 = (uVar351 != 0) * (uVar351 < 0x100) * cVar62 - (0xff < uVar351);
  auVar286[0xd] = cVar51;
  auVar289[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar63 - (0xff < uVar352);
  auVar289._0_14_ = auVar286;
  cVar50 = (uVar353 != 0) * (uVar353 < 0x100) * cVar64 - (0xff < uVar353);
  auVar289[0xf] = cVar50;
  uVar205 = (ushort)bVar65;
  uVar222 = (ushort)((uint)uVar230 >> 0x18);
  uVar223 = (ushort)((uint6)uVar231 >> 0x28);
  uVar224 = (ushort)((ulong)uVar248 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar249._0_10_ >> 0x48);
  uVar226 = auVar249._10_2_ >> 8;
  uVar227 = auVar252._12_2_ >> 8;
  uVar228 = auVar255._14_2_ >> 8;
  uVar343 = (ushort)bVar73;
  uVar347 = (ushort)((uint)uVar308 >> 0x18);
  uVar348 = (ushort)((uint6)uVar309 >> 0x28);
  uVar349 = (ushort)((ulong)uVar334 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar336._0_10_ >> 0x48);
  uVar351 = auVar336._10_2_ >> 8;
  uVar352 = auVar338._12_2_ >> 8;
  uVar353 = auVar342._14_2_ >> 8;
  bVar49 = (uVar222 != 0) * (uVar222 < 0x100) * cVar66 - (0xff < uVar222);
  cVar56 = (uVar224 != 0) * (uVar224 < 0x100) * cVar68 - (0xff < uVar224);
  uVar246 = CONCAT13(cVar56,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar67 - (0xff < uVar223),
                                     CONCAT11(bVar49,(uVar205 != 0) * (uVar205 < 0x100) * bVar65 -
                                                     (0xff < uVar205))));
  cVar63 = (uVar226 != 0) * (uVar226 < 0x100) * cVar70 - (0xff < uVar226);
  uVar247 = CONCAT15(cVar63,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar69 - (0xff < uVar225),
                                     uVar246));
  cVar64 = (uVar228 != 0) * (uVar228 < 0x100) * cVar72 - (0xff < uVar228);
  uVar248 = CONCAT17(cVar64,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar71 - (0xff < uVar227),
                                     uVar247));
  cVar62 = (uVar347 != 0) * (uVar347 < 0x100) * cVar74 - (0xff < uVar347);
  auVar250._0_10_ =
       CONCAT19(cVar62,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar73 - (0xff < uVar343),
                                uVar248));
  auVar250[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar2 - (0xff < uVar348);
  cVar8 = (uVar349 != 0) * (uVar349 < 0x100) * cVar8 - (0xff < uVar349);
  auVar250[0xb] = cVar8;
  auVar253[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar6 - (0xff < uVar350);
  auVar253._0_12_ = auVar250;
  cVar5 = (uVar351 != 0) * (uVar351 < 0x100) * cVar5 - (0xff < uVar351);
  auVar253[0xd] = cVar5;
  auVar256[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar3 - (0xff < uVar352);
  auVar256._0_14_ = auVar253;
  cVar3 = (uVar353 != 0) * (uVar353 < 0x100) * cVar4 - (0xff < uVar353);
  auVar256[0xf] = cVar3;
  uVar205 = (ushort)bVar1;
  uVar222 = (ushort)((uint)uVar187 >> 0x18);
  uVar223 = (ushort)((uint6)uVar188 >> 0x28);
  uVar224 = (ushort)((ulong)uVar190 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar192._0_10_ >> 0x48);
  uVar226 = auVar192._10_2_ >> 8;
  uVar227 = auVar196._12_2_ >> 8;
  uVar228 = auVar202._14_2_ >> 8;
  uVar343 = (ushort)bVar9;
  uVar347 = (ushort)((uint)uVar206 >> 0x18);
  uVar348 = (ushort)((uint6)uVar207 >> 0x28);
  uVar349 = (ushort)((ulong)uVar189 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar210._0_10_ >> 0x48);
  uVar351 = auVar210._10_2_ >> 8;
  uVar352 = auVar214._12_2_ >> 8;
  uVar353 = auVar219._14_2_ >> 8;
  bVar57 = (uVar222 != 0) * (uVar222 < 0x100) * cVar7 - (0xff < uVar222);
  cVar60 = (uVar224 != 0) * (uVar224 < 0x100) * cVar16 - (0xff < uVar224);
  uVar187 = CONCAT13(cVar60,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar14 - (0xff < uVar223),
                                     CONCAT11(bVar57,(uVar205 != 0) * (uVar205 < 0x100) * bVar1 -
                                                     (0xff < uVar205))));
  cVar16 = (uVar226 != 0) * (uVar226 < 0x100) * cVar13 - (0xff < uVar226);
  uVar188 = CONCAT15(cVar16,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar15 - (0xff < uVar225),
                                     uVar187));
  cVar15 = (uVar228 != 0) * (uVar228 < 0x100) * cVar11 - (0xff < uVar228);
  uVar190 = CONCAT17(cVar15,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar12 - (0xff < uVar227),
                                     uVar188));
  cVar2 = (uVar347 != 0) * (uVar347 < 0x100) * cVar31 - (0xff < uVar347);
  auVar193._0_10_ =
       CONCAT19(cVar2,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar9 - (0xff < uVar343),uVar190
                              ));
  auVar193[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar22 - (0xff < uVar348);
  cVar4 = (uVar349 != 0) * (uVar349 < 0x100) * cVar21 - (0xff < uVar349);
  auVar193[0xb] = cVar4;
  auVar197[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar20 - (0xff < uVar350);
  auVar197._0_12_ = auVar193;
  cVar7 = (uVar351 != 0) * (uVar351 < 0x100) * cVar19 - (0xff < uVar351);
  auVar197[0xd] = cVar7;
  auVar203[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar18 - (0xff < uVar352);
  auVar203._0_14_ = auVar197;
  cVar6 = (uVar353 != 0) * (uVar353 < 0x100) * cVar10 - (0xff < uVar353);
  auVar203[0xf] = cVar6;
  auVar199 = auVar306 & _DAT_0012a6d0;
  auVar217 = auVar325 & _DAT_0012a6d0;
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  bVar1 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  sVar76 = auVar199._4_2_;
  sVar83 = auVar199._6_2_;
  cVar14 = (0 < sVar83) * (sVar83 < 0x100) * auVar199[6] - (0xff < sVar83);
  uVar206 = CONCAT13(cVar14,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar199[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar1,(0 < sVar75) * (sVar75 < 0x100) * auVar199[0] -
                                                     (0xff < sVar75))));
  sVar75 = auVar199._8_2_;
  sVar76 = auVar199._10_2_;
  cVar13 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[10] - (0xff < sVar76);
  uVar207 = CONCAT15(cVar13,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75)
                                     ,uVar206));
  sVar75 = auVar199._12_2_;
  sVar76 = auVar199._14_2_;
  cVar12 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[0xe] - (0xff < sVar76);
  uVar189 = CONCAT17(cVar12,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] -
                                     (0xff < sVar75),uVar207));
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  cVar11 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  auVar211._0_10_ =
       CONCAT19(cVar11,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar217[0] - (0xff < sVar75),
                                uVar189));
  sVar75 = auVar217._4_2_;
  auVar211[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[4] - (0xff < sVar75);
  sVar75 = auVar217._6_2_;
  cVar10 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[6] - (0xff < sVar75);
  auVar211[0xb] = cVar10;
  sVar75 = auVar217._8_2_;
  auVar215[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75);
  auVar215._0_12_ = auVar211;
  sVar75 = auVar217._10_2_;
  cVar18 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[10] - (0xff < sVar75);
  auVar215[0xd] = cVar18;
  sVar75 = auVar217._12_2_;
  auVar220[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] - (0xff < sVar75);
  auVar220._0_14_ = auVar215;
  sVar75 = auVar217._14_2_;
  cVar19 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xe] - (0xff < sVar75);
  auVar220[0xf] = cVar19;
  auVar217 = auVar268 & _DAT_0012a6d0;
  auVar199 = auVar289 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar9 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar20 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar308 = CONCAT13(cVar20,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar9,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0] -
                                                     (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar59 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar309 = CONCAT15(cVar59,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar308));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar61 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar310 = CONCAT17(cVar61,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar309));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar58 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar312._0_10_ =
       CONCAT19(cVar58,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar310));
  sVar75 = auVar199._4_2_;
  auVar312[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar31 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar312[0xb] = cVar31;
  sVar75 = auVar199._8_2_;
  auVar314[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar314._0_12_ = auVar312;
  sVar75 = auVar199._10_2_;
  cVar22 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar314[0xd] = cVar22;
  sVar75 = auVar199._12_2_;
  auVar316[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar316._0_14_ = auVar314;
  sVar75 = auVar199._14_2_;
  cVar21 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar316[0xf] = cVar21;
  auVar199 = auVar256 & _DAT_0012a6d0;
  auVar217 = auVar203 & _DAT_0012a6d0;
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  bVar65 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  sVar76 = auVar199._4_2_;
  sVar83 = auVar199._6_2_;
  cVar66 = (0 < sVar83) * (sVar83 < 0x100) * auVar199[6] - (0xff < sVar83);
  uVar230 = CONCAT13(cVar66,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar199[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar65,(0 < sVar75) * (sVar75 < 0x100) * auVar199[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar199._8_2_;
  sVar76 = auVar199._10_2_;
  cVar67 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[10] - (0xff < sVar76);
  uVar231 = CONCAT15(cVar67,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75)
                                     ,uVar230));
  sVar75 = auVar199._12_2_;
  sVar76 = auVar199._14_2_;
  cVar68 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[0xe] - (0xff < sVar76);
  uVar208 = CONCAT17(cVar68,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] -
                                     (0xff < sVar75),uVar231));
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  cVar69 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  auVar232._0_10_ =
       CONCAT19(cVar69,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar217[0] - (0xff < sVar75),
                                uVar208));
  sVar75 = auVar217._4_2_;
  auVar232[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[4] - (0xff < sVar75);
  sVar75 = auVar217._6_2_;
  cVar70 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[6] - (0xff < sVar75);
  auVar232[0xb] = cVar70;
  sVar75 = auVar217._8_2_;
  auVar234[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75);
  auVar234._0_12_ = auVar232;
  sVar75 = auVar217._10_2_;
  cVar71 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[10] - (0xff < sVar75);
  auVar234[0xd] = cVar71;
  sVar75 = auVar217._12_2_;
  auVar236[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] - (0xff < sVar75);
  auVar236._0_14_ = auVar234;
  sVar75 = auVar217._14_2_;
  cVar72 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xe] - (0xff < sVar75);
  auVar236[0xf] = cVar72;
  uVar205 = (ushort)bVar17;
  uVar222 = (ushort)((uint)uVar298 >> 0x18);
  uVar223 = (ushort)((uint6)uVar299 >> 0x28);
  uVar224 = (ushort)((ulong)uVar300 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar301._0_10_ >> 0x48);
  uVar226 = auVar301._10_2_ >> 8;
  uVar227 = auVar303._12_2_ >> 8;
  uVar228 = auVar306._14_2_ >> 8;
  uVar343 = (ushort)bVar25;
  uVar347 = (ushort)((uint)uVar318 >> 0x18);
  uVar348 = (ushort)((uint6)uVar319 >> 0x28);
  uVar349 = (ushort)((ulong)uVar320 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar321._0_10_ >> 0x48);
  uVar351 = auVar321._10_2_ >> 8;
  uVar352 = auVar323._12_2_ >> 8;
  uVar353 = auVar325._14_2_ >> 8;
  bVar73 = (uVar222 != 0) * (uVar222 < 0x100) * cVar23 - (0xff < uVar222);
  cVar23 = (uVar224 != 0) * (uVar224 < 0x100) * cVar32 - (0xff < uVar224);
  uVar298 = CONCAT13(cVar23,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar24 - (0xff < uVar223),
                                     CONCAT11(bVar73,(uVar205 != 0) * (uVar205 < 0x100) * bVar17 -
                                                     (0xff < uVar205))));
  cVar74 = (uVar226 != 0) * (uVar226 < 0x100) * cVar28 - (0xff < uVar226);
  uVar299 = CONCAT15(cVar74,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar30 - (0xff < uVar225),
                                     uVar298));
  cVar27 = (uVar228 != 0) * (uVar228 < 0x100) * cVar27 - (0xff < uVar228);
  uVar300 = CONCAT17(cVar27,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar26 - (0xff < uVar227),
                                     uVar299));
  cVar28 = (uVar347 != 0) * (uVar347 < 0x100) * cVar39 - (0xff < uVar347);
  auVar302._0_10_ =
       CONCAT19(cVar28,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar25 - (0xff < uVar343),
                                uVar300));
  auVar302[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar38 - (0xff < uVar348);
  cVar30 = (uVar349 != 0) * (uVar349 < 0x100) * cVar37 - (0xff < uVar349);
  auVar302[0xb] = cVar30;
  auVar304[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar36 - (0xff < uVar350);
  auVar304._0_12_ = auVar302;
  cVar32 = (uVar351 != 0) * (uVar351 < 0x100) * cVar29 - (0xff < uVar351);
  auVar304[0xd] = cVar32;
  auVar307[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar35 - (0xff < uVar352);
  auVar307._0_14_ = auVar304;
  cVar24 = (uVar353 != 0) * (uVar353 < 0x100) * cVar34 - (0xff < uVar353);
  auVar307[0xf] = cVar24;
  uVar205 = (ushort)bVar33;
  uVar222 = (ushort)((uint)uVar259 >> 0x18);
  uVar223 = (ushort)((uint6)uVar260 >> 0x28);
  uVar224 = (ushort)((ulong)uVar261 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar262._0_10_ >> 0x48);
  uVar226 = auVar262._10_2_ >> 8;
  uVar227 = auVar265._12_2_ >> 8;
  uVar228 = auVar268._14_2_ >> 8;
  uVar343 = (ushort)bVar41;
  uVar347 = (ushort)((uint)uVar279 >> 0x18);
  uVar348 = (ushort)((uint6)uVar280 >> 0x28);
  uVar349 = (ushort)((ulong)uVar281 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar283._0_10_ >> 0x48);
  uVar351 = auVar283._10_2_ >> 8;
  uVar352 = auVar286._12_2_ >> 8;
  uVar353 = auVar289._14_2_ >> 8;
  bVar17 = (uVar222 != 0) * (uVar222 < 0x100) * cVar40 - (0xff < uVar222);
  cVar37 = (uVar224 != 0) * (uVar224 < 0x100) * cVar48 - (0xff < uVar224);
  uVar259 = CONCAT13(cVar37,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar45 - (0xff < uVar223),
                                     CONCAT11(bVar17,(uVar205 != 0) * (uVar205 < 0x100) * bVar33 -
                                                     (0xff < uVar205))));
  cVar36 = (uVar226 != 0) * (uVar226 < 0x100) * cVar46 - (0xff < uVar226);
  uVar260 = CONCAT15(cVar36,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar47 - (0xff < uVar225),
                                     uVar259));
  cVar35 = (uVar228 != 0) * (uVar228 < 0x100) * cVar43 - (0xff < uVar228);
  uVar261 = CONCAT17(cVar35,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar44 - (0xff < uVar227),
                                     uVar260));
  cVar38 = (uVar347 != 0) * (uVar347 < 0x100) * cVar42 - (0xff < uVar347);
  auVar263._0_10_ =
       CONCAT19(cVar38,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar41 - (0xff < uVar343),
                                uVar261));
  auVar263[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar54 - (0xff < uVar348);
  cVar34 = (uVar349 != 0) * (uVar349 < 0x100) * cVar53 - (0xff < uVar349);
  auVar263[0xb] = cVar34;
  auVar266[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar55 - (0xff < uVar350);
  auVar266._0_12_ = auVar263;
  cVar29 = (uVar351 != 0) * (uVar351 < 0x100) * cVar52 - (0xff < uVar351);
  auVar266[0xd] = cVar29;
  auVar269[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar51 - (0xff < uVar352);
  auVar269._0_14_ = auVar266;
  cVar26 = (uVar353 != 0) * (uVar353 < 0x100) * cVar50 - (0xff < uVar353);
  auVar269[0xf] = cVar26;
  uVar343 = (ushort)bVar49;
  uVar347 = (ushort)((uint)uVar246 >> 0x18);
  uVar348 = (ushort)((uint6)uVar247 >> 0x28);
  uVar349 = (ushort)((ulong)uVar248 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar250._0_10_ >> 0x48);
  uVar351 = auVar250._10_2_ >> 8;
  uVar352 = auVar253._12_2_ >> 8;
  uVar353 = auVar256._14_2_ >> 8;
  uVar205 = (ushort)bVar57;
  uVar222 = (ushort)((uint)uVar187 >> 0x18);
  uVar223 = (ushort)((uint6)uVar188 >> 0x28);
  uVar224 = (ushort)((ulong)uVar190 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar193._0_10_ >> 0x48);
  uVar226 = auVar193._10_2_ >> 8;
  uVar227 = auVar197._12_2_ >> 8;
  uVar228 = auVar203._14_2_ >> 8;
  bVar25 = (uVar347 != 0) * (uVar347 < 0x100) * cVar56 - (0xff < uVar347);
  cVar39 = (uVar349 != 0) * (uVar349 < 0x100) * cVar64 - (0xff < uVar349);
  uVar246 = CONCAT13(cVar39,CONCAT12((uVar348 != 0) * (uVar348 < 0x100) * cVar63 - (0xff < uVar348),
                                     CONCAT11(bVar25,(uVar343 != 0) * (uVar343 < 0x100) * bVar49 -
                                                     (0xff < uVar343))));
  cVar8 = (uVar351 != 0) * (uVar351 < 0x100) * cVar8 - (0xff < uVar351);
  uVar247 = CONCAT15(cVar8,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar62 - (0xff < uVar350),
                                    uVar246));
  cVar3 = (uVar353 != 0) * (uVar353 < 0x100) * cVar3 - (0xff < uVar353);
  uVar248 = CONCAT17(cVar3,CONCAT16((uVar352 != 0) * (uVar352 < 0x100) * cVar5 - (0xff < uVar352),
                                    uVar247));
  cVar5 = (uVar222 != 0) * (uVar222 < 0x100) * cVar60 - (0xff < uVar222);
  auVar251._0_10_ =
       CONCAT19(cVar5,CONCAT18((uVar205 != 0) * (uVar205 < 0x100) * bVar57 - (0xff < uVar205),
                               uVar248));
  auVar251[10] = (uVar223 != 0) * (uVar223 < 0x100) * cVar16 - (0xff < uVar223);
  cVar15 = (uVar224 != 0) * (uVar224 < 0x100) * cVar15 - (0xff < uVar224);
  auVar251[0xb] = cVar15;
  auVar254[0xc] = (uVar225 != 0) * (uVar225 < 0x100) * cVar2 - (0xff < uVar225);
  auVar254._0_12_ = auVar251;
  cVar4 = (uVar226 != 0) * (uVar226 < 0x100) * cVar4 - (0xff < uVar226);
  auVar254[0xd] = cVar4;
  auVar257[0xe] = (uVar227 != 0) * (uVar227 < 0x100) * cVar7 - (0xff < uVar227);
  auVar257._0_14_ = auVar254;
  cVar6 = (uVar228 != 0) * (uVar228 < 0x100) * cVar6 - (0xff < uVar228);
  auVar257[0xf] = cVar6;
  auVar199 = auVar220 & _DAT_0012a6d0;
  auVar217 = auVar316 & _DAT_0012a6d0;
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  bVar33 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  sVar76 = auVar199._4_2_;
  sVar83 = auVar199._6_2_;
  cVar47 = (0 < sVar83) * (sVar83 < 0x100) * auVar199[6] - (0xff < sVar83);
  uVar187 = CONCAT13(cVar47,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar199[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar33,(0 < sVar75) * (sVar75 < 0x100) * auVar199[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar199._8_2_;
  sVar76 = auVar199._10_2_;
  cVar48 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[10] - (0xff < sVar76);
  uVar188 = CONCAT15(cVar48,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75)
                                     ,uVar187));
  sVar75 = auVar199._12_2_;
  sVar76 = auVar199._14_2_;
  cVar45 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[0xe] - (0xff < sVar76);
  uVar190 = CONCAT17(cVar45,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] -
                                     (0xff < sVar75),uVar188));
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  cVar7 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  auVar194._0_10_ =
       CONCAT19(cVar7,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar217[0] - (0xff < sVar75),
                               uVar190));
  sVar75 = auVar217._4_2_;
  auVar194[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[4] - (0xff < sVar75);
  sVar75 = auVar217._6_2_;
  cVar40 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[6] - (0xff < sVar75);
  auVar194[0xb] = cVar40;
  sVar75 = auVar217._8_2_;
  auVar198[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75);
  auVar198._0_12_ = auVar194;
  sVar75 = auVar217._10_2_;
  cVar16 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[10] - (0xff < sVar75);
  auVar198[0xd] = cVar16;
  sVar75 = auVar217._12_2_;
  auVar204[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] - (0xff < sVar75);
  auVar204._0_14_ = auVar198;
  sVar75 = auVar217._14_2_;
  cVar2 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xe] - (0xff < sVar75);
  auVar204[0xf] = cVar2;
  auVar217 = auVar236 & _DAT_0012a6d0;
  auVar199 = auVar307 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  bVar41 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  sVar76 = auVar217._4_2_;
  sVar83 = auVar217._6_2_;
  cVar46 = (0 < sVar83) * (sVar83 < 0x100) * auVar217[6] - (0xff < sVar83);
  uVar318 = CONCAT13(cVar46,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar217[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar41,(0 < sVar75) * (sVar75 < 0x100) * auVar217[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar217._8_2_;
  sVar76 = auVar217._10_2_;
  cVar44 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[10] - (0xff < sVar76);
  uVar319 = CONCAT15(cVar44,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75)
                                     ,uVar318));
  sVar75 = auVar217._12_2_;
  sVar76 = auVar217._14_2_;
  cVar43 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[0xe] - (0xff < sVar76);
  uVar320 = CONCAT17(cVar43,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] -
                                     (0xff < sVar75),uVar319));
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  cVar42 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  auVar322._0_10_ =
       CONCAT19(cVar42,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar199[0] - (0xff < sVar75),
                                uVar320));
  sVar75 = auVar199._4_2_;
  auVar322[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[4] - (0xff < sVar75);
  sVar75 = auVar199._6_2_;
  cVar50 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[6] - (0xff < sVar75);
  auVar322[0xb] = cVar50;
  sVar75 = auVar199._8_2_;
  auVar324[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75);
  auVar324._0_12_ = auVar322;
  sVar75 = auVar199._10_2_;
  cVar51 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[10] - (0xff < sVar75);
  auVar324[0xd] = cVar51;
  sVar75 = auVar199._12_2_;
  auVar326[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] - (0xff < sVar75);
  auVar326._0_14_ = auVar324;
  sVar75 = auVar199._14_2_;
  cVar52 = (0 < sVar75) * (sVar75 < 0x100) * auVar199[0xe] - (0xff < sVar75);
  auVar326[0xf] = cVar52;
  auVar199 = auVar269 & _DAT_0012a6d0;
  auVar217 = auVar257 & _DAT_0012a6d0;
  sVar75 = auVar199._0_2_;
  sVar76 = auVar199._2_2_;
  bVar49 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[2] - (0xff < sVar76);
  sVar76 = auVar199._4_2_;
  sVar83 = auVar199._6_2_;
  cVar64 = (0 < sVar83) * (sVar83 < 0x100) * auVar199[6] - (0xff < sVar83);
  uVar279 = CONCAT13(cVar64,CONCAT12((0 < sVar76) * (sVar76 < 0x100) * auVar199[4] - (0xff < sVar76)
                                     ,CONCAT11(bVar49,(0 < sVar75) * (sVar75 < 0x100) * auVar199[0]
                                                      - (0xff < sVar75))));
  sVar75 = auVar199._8_2_;
  sVar76 = auVar199._10_2_;
  cVar53 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[10] - (0xff < sVar76);
  uVar280 = CONCAT15(cVar53,CONCAT14((0 < sVar75) * (sVar75 < 0x100) * auVar199[8] - (0xff < sVar75)
                                     ,uVar279));
  sVar75 = auVar199._12_2_;
  sVar76 = auVar199._14_2_;
  cVar63 = (0 < sVar76) * (sVar76 < 0x100) * auVar199[0xe] - (0xff < sVar76);
  uVar281 = CONCAT17(cVar63,CONCAT16((0 < sVar75) * (sVar75 < 0x100) * auVar199[0xc] -
                                     (0xff < sVar75),uVar280));
  sVar75 = auVar217._0_2_;
  sVar76 = auVar217._2_2_;
  cVar62 = (0 < sVar76) * (sVar76 < 0x100) * auVar217[2] - (0xff < sVar76);
  auVar284._0_10_ =
       CONCAT19(cVar62,CONCAT18((0 < sVar75) * (sVar75 < 0x100) * auVar217[0] - (0xff < sVar75),
                                uVar281));
  sVar75 = auVar217._4_2_;
  auVar284[10] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[4] - (0xff < sVar75);
  sVar75 = auVar217._6_2_;
  cVar56 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[6] - (0xff < sVar75);
  auVar284[0xb] = cVar56;
  sVar75 = auVar217._8_2_;
  auVar287[0xc] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[8] - (0xff < sVar75);
  auVar287._0_12_ = auVar284;
  sVar75 = auVar217._10_2_;
  cVar55 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[10] - (0xff < sVar75);
  auVar287[0xd] = cVar55;
  sVar75 = auVar217._12_2_;
  auVar290[0xe] = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xc] - (0xff < sVar75);
  auVar290._0_14_ = auVar287;
  sVar75 = auVar217._14_2_;
  cVar54 = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0xe] - (0xff < sVar75);
  auVar290[0xf] = cVar54;
  uVar205 = (ushort)bVar1;
  uVar222 = (ushort)((uint)uVar206 >> 0x18);
  uVar223 = (ushort)((uint6)uVar207 >> 0x28);
  uVar224 = (ushort)((ulong)uVar189 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar211._0_10_ >> 0x48);
  uVar226 = auVar211._10_2_ >> 8;
  uVar227 = auVar215._12_2_ >> 8;
  uVar228 = auVar220._14_2_ >> 8;
  uVar343 = (ushort)bVar9;
  uVar347 = (ushort)((uint)uVar308 >> 0x18);
  uVar348 = (ushort)((uint6)uVar309 >> 0x28);
  uVar349 = (ushort)((ulong)uVar310 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar312._0_10_ >> 0x48);
  uVar351 = auVar312._10_2_ >> 8;
  uVar352 = auVar314._12_2_ >> 8;
  uVar353 = auVar316._14_2_ >> 8;
  bVar57 = (uVar222 != 0) * (uVar222 < 0x100) * cVar14 - (0xff < uVar222);
  cVar14 = (uVar224 != 0) * (uVar224 < 0x100) * cVar12 - (0xff < uVar224);
  uVar206 = CONCAT13(cVar14,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar13 - (0xff < uVar223),
                                     CONCAT11(bVar57,(uVar205 != 0) * (uVar205 < 0x100) * bVar1 -
                                                     (0xff < uVar205))));
  cVar13 = (uVar226 != 0) * (uVar226 < 0x100) * cVar10 - (0xff < uVar226);
  uVar207 = CONCAT15(cVar13,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar11 - (0xff < uVar225),
                                     uVar206));
  cVar12 = (uVar228 != 0) * (uVar228 < 0x100) * cVar19 - (0xff < uVar228);
  uVar189 = CONCAT17(cVar12,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar18 - (0xff < uVar227),
                                     uVar207));
  cVar11 = (uVar347 != 0) * (uVar347 < 0x100) * cVar20 - (0xff < uVar347);
  auVar212._0_10_ =
       CONCAT19(cVar11,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar9 - (0xff < uVar343),
                                uVar189));
  auVar212[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar59 - (0xff < uVar348);
  cVar10 = (uVar349 != 0) * (uVar349 < 0x100) * cVar61 - (0xff < uVar349);
  auVar212[0xb] = cVar10;
  auVar216[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar58 - (0xff < uVar350);
  auVar216._0_12_ = auVar212;
  cVar18 = (uVar351 != 0) * (uVar351 < 0x100) * cVar31 - (0xff < uVar351);
  auVar216[0xd] = cVar18;
  auVar221[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar22 - (0xff < uVar352);
  auVar221._0_14_ = auVar216;
  cVar19 = (uVar353 != 0) * (uVar353 < 0x100) * cVar21 - (0xff < uVar353);
  auVar221[0xf] = cVar19;
  uVar205 = (ushort)bVar65;
  uVar222 = (ushort)((uint)uVar230 >> 0x18);
  uVar223 = (ushort)((uint6)uVar231 >> 0x28);
  uVar224 = (ushort)((ulong)uVar208 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar232._0_10_ >> 0x48);
  uVar226 = auVar232._10_2_ >> 8;
  uVar227 = auVar234._12_2_ >> 8;
  uVar228 = auVar236._14_2_ >> 8;
  uVar343 = (ushort)bVar73;
  uVar347 = (ushort)((uint)uVar298 >> 0x18);
  uVar348 = (ushort)((uint6)uVar299 >> 0x28);
  uVar349 = (ushort)((ulong)uVar300 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar302._0_10_ >> 0x48);
  uVar351 = auVar302._10_2_ >> 8;
  uVar352 = auVar304._12_2_ >> 8;
  uVar353 = auVar307._14_2_ >> 8;
  bVar1 = (uVar222 != 0) * (uVar222 < 0x100) * cVar66 - (0xff < uVar222);
  cVar61 = (uVar224 != 0) * (uVar224 < 0x100) * cVar68 - (0xff < uVar224);
  uVar230 = CONCAT13(cVar61,CONCAT12((uVar223 != 0) * (uVar223 < 0x100) * cVar67 - (0xff < uVar223),
                                     CONCAT11(bVar1,(uVar205 != 0) * (uVar205 < 0x100) * bVar65 -
                                                    (0xff < uVar205))));
  cVar60 = (uVar226 != 0) * (uVar226 < 0x100) * cVar70 - (0xff < uVar226);
  uVar231 = CONCAT15(cVar60,CONCAT14((uVar225 != 0) * (uVar225 < 0x100) * cVar69 - (0xff < uVar225),
                                     uVar230));
  cVar20 = (uVar228 != 0) * (uVar228 < 0x100) * cVar72 - (0xff < uVar228);
  uVar208 = CONCAT17(cVar20,CONCAT16((uVar227 != 0) * (uVar227 < 0x100) * cVar71 - (0xff < uVar227),
                                     uVar231));
  cVar31 = (uVar347 != 0) * (uVar347 < 0x100) * cVar23 - (0xff < uVar347);
  auVar233._0_10_ =
       CONCAT19(cVar31,CONCAT18((uVar343 != 0) * (uVar343 < 0x100) * bVar73 - (0xff < uVar343),
                                uVar208));
  auVar233[10] = (uVar348 != 0) * (uVar348 < 0x100) * cVar74 - (0xff < uVar348);
  cVar23 = (uVar349 != 0) * (uVar349 < 0x100) * cVar27 - (0xff < uVar349);
  auVar233[0xb] = cVar23;
  auVar235[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * cVar28 - (0xff < uVar350);
  auVar235._0_12_ = auVar233;
  cVar22 = (uVar351 != 0) * (uVar351 < 0x100) * cVar30 - (0xff < uVar351);
  auVar235[0xd] = cVar22;
  auVar237[0xe] = (uVar352 != 0) * (uVar352 < 0x100) * cVar32 - (0xff < uVar352);
  auVar237._0_14_ = auVar235;
  cVar21 = (uVar353 != 0) * (uVar353 < 0x100) * cVar24 - (0xff < uVar353);
  auVar237[0xf] = cVar21;
  uVar343 = (ushort)bVar17;
  uVar347 = (ushort)((uint)uVar259 >> 0x18);
  uVar348 = (ushort)((uint6)uVar260 >> 0x28);
  uVar349 = (ushort)((ulong)uVar261 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar263._0_10_ >> 0x48);
  uVar351 = auVar263._10_2_ >> 8;
  uVar352 = auVar266._12_2_ >> 8;
  uVar353 = auVar269._14_2_ >> 8;
  uVar205 = (ushort)bVar25;
  uVar222 = (ushort)((uint)uVar246 >> 0x18);
  uVar223 = (ushort)((uint6)uVar247 >> 0x28);
  uVar224 = (ushort)((ulong)uVar248 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar251._0_10_ >> 0x48);
  uVar226 = auVar251._10_2_ >> 8;
  uVar227 = auVar254._12_2_ >> 8;
  uVar228 = auVar257._14_2_ >> 8;
  bVar9 = (uVar347 != 0) * (uVar347 < 0x100) * cVar37 - (0xff < uVar347);
  cVar24 = (uVar349 != 0) * (uVar349 < 0x100) * cVar35 - (0xff < uVar349);
  uVar246 = CONCAT13(cVar24,CONCAT12((uVar348 != 0) * (uVar348 < 0x100) * cVar36 - (0xff < uVar348),
                                     CONCAT11(bVar9,(uVar343 != 0) * (uVar343 < 0x100) * bVar17 -
                                                    (0xff < uVar343))));
  cVar32 = (uVar351 != 0) * (uVar351 < 0x100) * cVar34 - (0xff < uVar351);
  uVar247 = CONCAT15(cVar32,CONCAT14((uVar350 != 0) * (uVar350 < 0x100) * cVar38 - (0xff < uVar350),
                                     uVar246));
  cVar30 = (uVar353 != 0) * (uVar353 < 0x100) * cVar26 - (0xff < uVar353);
  uVar248 = CONCAT17(cVar30,CONCAT16((uVar352 != 0) * (uVar352 < 0x100) * cVar29 - (0xff < uVar352),
                                     uVar247));
  cVar28 = (uVar222 != 0) * (uVar222 < 0x100) * cVar39 - (0xff < uVar222);
  auVar264._0_10_ =
       CONCAT19(cVar28,CONCAT18((uVar205 != 0) * (uVar205 < 0x100) * bVar25 - (0xff < uVar205),
                                uVar248));
  auVar264[10] = (uVar223 != 0) * (uVar223 < 0x100) * cVar8 - (0xff < uVar223);
  cVar3 = (uVar224 != 0) * (uVar224 < 0x100) * cVar3 - (0xff < uVar224);
  auVar264[0xb] = cVar3;
  auVar267[0xc] = (uVar225 != 0) * (uVar225 < 0x100) * cVar5 - (0xff < uVar225);
  auVar267._0_12_ = auVar264;
  cVar5 = (uVar226 != 0) * (uVar226 < 0x100) * cVar15 - (0xff < uVar226);
  auVar267[0xd] = cVar5;
  auVar270[0xe] = (uVar227 != 0) * (uVar227 < 0x100) * cVar4 - (0xff < uVar227);
  auVar270._0_14_ = auVar267;
  cVar4 = (uVar228 != 0) * (uVar228 < 0x100) * cVar6 - (0xff < uVar228);
  auVar270[0xf] = cVar4;
  auVar217 = auVar204 & _DAT_0012a6d0;
  auVar305 = auVar326 & _DAT_0012a6d0;
  sVar75 = auVar217._0_2_;
  sVar77 = auVar217._2_2_;
  sVar80 = auVar217._4_2_;
  sVar84 = auVar217._6_2_;
  sVar87 = auVar217._8_2_;
  sVar90 = auVar217._10_2_;
  sVar93 = auVar217._12_2_;
  sVar96 = auVar217._14_2_;
  sVar99 = auVar305._0_2_;
  sVar102 = auVar305._2_2_;
  sVar105 = auVar305._4_2_;
  sVar108 = auVar305._6_2_;
  sVar111 = auVar305._8_2_;
  sVar114 = auVar305._10_2_;
  sVar117 = auVar305._12_2_;
  sVar120 = auVar305._14_2_;
  auVar339 = auVar290 & _DAT_0012a6d0;
  auVar365 = auVar221 & _DAT_0012a6d0;
  sVar76 = auVar339._0_2_;
  sVar78 = auVar339._2_2_;
  sVar81 = auVar339._4_2_;
  sVar85 = auVar339._6_2_;
  sVar88 = auVar339._8_2_;
  sVar91 = auVar339._10_2_;
  sVar94 = auVar339._12_2_;
  sVar97 = auVar339._14_2_;
  sVar100 = auVar365._0_2_;
  sVar103 = auVar365._2_2_;
  sVar106 = auVar365._4_2_;
  sVar109 = auVar365._6_2_;
  sVar112 = auVar365._8_2_;
  sVar115 = auVar365._10_2_;
  sVar118 = auVar365._12_2_;
  sVar121 = auVar365._14_2_;
  auVar364 = auVar237 & _DAT_0012a6d0;
  auVar199 = _DAT_0012a6d0 & auVar270;
  sVar83 = auVar364._0_2_;
  sVar79 = auVar364._2_2_;
  sVar82 = auVar364._4_2_;
  sVar86 = auVar364._6_2_;
  sVar89 = auVar364._8_2_;
  sVar92 = auVar364._10_2_;
  sVar95 = auVar364._12_2_;
  sVar98 = auVar364._14_2_;
  sVar101 = auVar199._0_2_;
  sVar104 = auVar199._2_2_;
  sVar107 = auVar199._4_2_;
  sVar110 = auVar199._6_2_;
  sVar113 = auVar199._8_2_;
  sVar116 = auVar199._10_2_;
  sVar119 = auVar199._12_2_;
  sVar122 = auVar199._14_2_;
  uVar205 = (ushort)bVar33;
  uVar222 = (ushort)((uint)uVar187 >> 0x18);
  uVar223 = (ushort)((uint6)uVar188 >> 0x28);
  uVar224 = (ushort)((ulong)uVar190 >> 0x38);
  uVar225 = (ushort)((unkuint10)auVar194._0_10_ >> 0x48);
  uVar226 = auVar194._10_2_ >> 8;
  uVar227 = auVar198._12_2_ >> 8;
  uVar228 = auVar204._14_2_ >> 8;
  uVar317 = (ushort)bVar41;
  uVar327 = (ushort)((uint)uVar318 >> 0x18);
  uVar328 = (ushort)((uint6)uVar319 >> 0x28);
  uVar329 = (ushort)((ulong)uVar320 >> 0x38);
  uVar330 = (ushort)((unkuint10)auVar322._0_10_ >> 0x48);
  uVar331 = auVar322._10_2_ >> 8;
  uVar332 = auVar324._12_2_ >> 8;
  uVar333 = auVar326._14_2_ >> 8;
  uVar278 = (ushort)bVar49;
  uVar291 = (ushort)((uint)uVar279 >> 0x18);
  uVar292 = (ushort)((uint6)uVar280 >> 0x28);
  uVar293 = (ushort)((ulong)uVar281 >> 0x38);
  uVar294 = (ushort)((unkuint10)auVar284._0_10_ >> 0x48);
  uVar295 = auVar284._10_2_ >> 8;
  uVar296 = auVar287._12_2_ >> 8;
  uVar297 = auVar290._14_2_ >> 8;
  uVar343 = (ushort)bVar57;
  uVar347 = (ushort)((uint)uVar206 >> 0x18);
  uVar348 = (ushort)((uint6)uVar207 >> 0x28);
  uVar349 = (ushort)((ulong)uVar189 >> 0x38);
  uVar350 = (ushort)((unkuint10)auVar212._0_10_ >> 0x48);
  uVar351 = auVar212._10_2_ >> 8;
  uVar352 = auVar216._12_2_ >> 8;
  uVar353 = auVar221._14_2_ >> 8;
  uVar229 = (ushort)bVar1;
  uVar238 = (ushort)((uint)uVar230 >> 0x18);
  uVar239 = (ushort)((uint6)uVar231 >> 0x28);
  uVar240 = (ushort)((ulong)uVar208 >> 0x38);
  uVar241 = (ushort)((unkuint10)auVar233._0_10_ >> 0x48);
  uVar242 = auVar233._10_2_ >> 8;
  uVar243 = auVar235._12_2_ >> 8;
  uVar244 = auVar237._14_2_ >> 8;
  uVar258 = (ushort)bVar9;
  uVar271 = (ushort)((uint)uVar246 >> 0x18);
  uVar272 = (ushort)((uint6)uVar247 >> 0x28);
  uVar273 = (ushort)((ulong)uVar248 >> 0x38);
  uVar274 = (ushort)((unkuint10)auVar264._0_10_ >> 0x48);
  uVar275 = auVar264._10_2_ >> 8;
  uVar276 = auVar267._12_2_ >> 8;
  uVar277 = auVar270._14_2_ >> 8;
  *dst = (0 < sVar75) * (sVar75 < 0x100) * auVar217[0] - (0xff < sVar75);
  dst[1] = (0 < sVar77) * (sVar77 < 0x100) * auVar217[2] - (0xff < sVar77);
  dst[2] = (0 < sVar80) * (sVar80 < 0x100) * auVar217[4] - (0xff < sVar80);
  dst[3] = (0 < sVar84) * (sVar84 < 0x100) * auVar217[6] - (0xff < sVar84);
  dst[4] = (0 < sVar87) * (sVar87 < 0x100) * auVar217[8] - (0xff < sVar87);
  dst[5] = (0 < sVar90) * (sVar90 < 0x100) * auVar217[10] - (0xff < sVar90);
  dst[6] = (0 < sVar93) * (sVar93 < 0x100) * auVar217[0xc] - (0xff < sVar93);
  dst[7] = (0 < sVar96) * (sVar96 < 0x100) * auVar217[0xe] - (0xff < sVar96);
  dst[8] = (0 < sVar99) * (sVar99 < 0x100) * auVar305[0] - (0xff < sVar99);
  dst[9] = (0 < sVar102) * (sVar102 < 0x100) * auVar305[2] - (0xff < sVar102);
  dst[10] = (0 < sVar105) * (sVar105 < 0x100) * auVar305[4] - (0xff < sVar105);
  dst[0xb] = (0 < sVar108) * (sVar108 < 0x100) * auVar305[6] - (0xff < sVar108);
  dst[0xc] = (0 < sVar111) * (sVar111 < 0x100) * auVar305[8] - (0xff < sVar111);
  dst[0xd] = (0 < sVar114) * (sVar114 < 0x100) * auVar305[10] - (0xff < sVar114);
  dst[0xe] = (0 < sVar117) * (sVar117 < 0x100) * auVar305[0xc] - (0xff < sVar117);
  dst[0xf] = (0 < sVar120) * (sVar120 < 0x100) * auVar305[0xe] - (0xff < sVar120);
  dst[0x10] = (0 < sVar76) * (sVar76 < 0x100) * auVar339[0] - (0xff < sVar76);
  dst[0x11] = (0 < sVar78) * (sVar78 < 0x100) * auVar339[2] - (0xff < sVar78);
  dst[0x12] = (0 < sVar81) * (sVar81 < 0x100) * auVar339[4] - (0xff < sVar81);
  dst[0x13] = (0 < sVar85) * (sVar85 < 0x100) * auVar339[6] - (0xff < sVar85);
  dst[0x14] = (0 < sVar88) * (sVar88 < 0x100) * auVar339[8] - (0xff < sVar88);
  dst[0x15] = (0 < sVar91) * (sVar91 < 0x100) * auVar339[10] - (0xff < sVar91);
  dst[0x16] = (0 < sVar94) * (sVar94 < 0x100) * auVar339[0xc] - (0xff < sVar94);
  dst[0x17] = (0 < sVar97) * (sVar97 < 0x100) * auVar339[0xe] - (0xff < sVar97);
  dst[0x18] = (0 < sVar100) * (sVar100 < 0x100) * auVar365[0] - (0xff < sVar100);
  dst[0x19] = (0 < sVar103) * (sVar103 < 0x100) * auVar365[2] - (0xff < sVar103);
  dst[0x1a] = (0 < sVar106) * (sVar106 < 0x100) * auVar365[4] - (0xff < sVar106);
  dst[0x1b] = (0 < sVar109) * (sVar109 < 0x100) * auVar365[6] - (0xff < sVar109);
  dst[0x1c] = (0 < sVar112) * (sVar112 < 0x100) * auVar365[8] - (0xff < sVar112);
  dst[0x1d] = (0 < sVar115) * (sVar115 < 0x100) * auVar365[10] - (0xff < sVar115);
  dst[0x1e] = (0 < sVar118) * (sVar118 < 0x100) * auVar365[0xc] - (0xff < sVar118);
  dst[0x1f] = (0 < sVar121) * (sVar121 < 0x100) * auVar365[0xe] - (0xff < sVar121);
  dst[0x20] = (0 < sVar83) * (sVar83 < 0x100) * auVar364[0] - (0xff < sVar83);
  dst[0x21] = (0 < sVar79) * (sVar79 < 0x100) * auVar364[2] - (0xff < sVar79);
  dst[0x22] = (0 < sVar82) * (sVar82 < 0x100) * auVar364[4] - (0xff < sVar82);
  dst[0x23] = (0 < sVar86) * (sVar86 < 0x100) * auVar364[6] - (0xff < sVar86);
  dst[0x24] = (0 < sVar89) * (sVar89 < 0x100) * auVar364[8] - (0xff < sVar89);
  dst[0x25] = (0 < sVar92) * (sVar92 < 0x100) * auVar364[10] - (0xff < sVar92);
  dst[0x26] = (0 < sVar95) * (sVar95 < 0x100) * auVar364[0xc] - (0xff < sVar95);
  dst[0x27] = (0 < sVar98) * (sVar98 < 0x100) * auVar364[0xe] - (0xff < sVar98);
  dst[0x28] = (0 < sVar101) * (sVar101 < 0x100) * auVar199[0] - (0xff < sVar101);
  dst[0x29] = (0 < sVar104) * (sVar104 < 0x100) * auVar199[2] - (0xff < sVar104);
  dst[0x2a] = (0 < sVar107) * (sVar107 < 0x100) * auVar199[4] - (0xff < sVar107);
  dst[0x2b] = (0 < sVar110) * (sVar110 < 0x100) * auVar199[6] - (0xff < sVar110);
  dst[0x2c] = (0 < sVar113) * (sVar113 < 0x100) * auVar199[8] - (0xff < sVar113);
  dst[0x2d] = (0 < sVar116) * (sVar116 < 0x100) * auVar199[10] - (0xff < sVar116);
  dst[0x2e] = (0 < sVar119) * (sVar119 < 0x100) * auVar199[0xc] - (0xff < sVar119);
  dst[0x2f] = (0 < sVar122) * (sVar122 < 0x100) * auVar199[0xe] - (0xff < sVar122);
  dst[0x30] = (uVar205 != 0) * (uVar205 < 0x100) * bVar33 - (0xff < uVar205);
  dst[0x31] = (uVar222 != 0) * (uVar222 < 0x100) * cVar47 - (0xff < uVar222);
  dst[0x32] = (uVar223 != 0) * (uVar223 < 0x100) * cVar48 - (0xff < uVar223);
  dst[0x33] = (uVar224 != 0) * (uVar224 < 0x100) * cVar45 - (0xff < uVar224);
  dst[0x34] = (uVar225 != 0) * (uVar225 < 0x100) * cVar7 - (0xff < uVar225);
  dst[0x35] = (uVar226 != 0) * (uVar226 < 0x100) * cVar40 - (0xff < uVar226);
  dst[0x36] = (uVar227 != 0) * (uVar227 < 0x100) * cVar16 - (0xff < uVar227);
  dst[0x37] = (uVar228 != 0) * (uVar228 < 0x100) * cVar2 - (0xff < uVar228);
  dst[0x38] = (uVar317 != 0) * (uVar317 < 0x100) * bVar41 - (0xff < uVar317);
  dst[0x39] = (uVar327 != 0) * (uVar327 < 0x100) * cVar46 - (0xff < uVar327);
  dst[0x3a] = (uVar328 != 0) * (uVar328 < 0x100) * cVar44 - (0xff < uVar328);
  dst[0x3b] = (uVar329 != 0) * (uVar329 < 0x100) * cVar43 - (0xff < uVar329);
  dst[0x3c] = (uVar330 != 0) * (uVar330 < 0x100) * cVar42 - (0xff < uVar330);
  dst[0x3d] = (uVar331 != 0) * (uVar331 < 0x100) * cVar50 - (0xff < uVar331);
  dst[0x3e] = (uVar332 != 0) * (uVar332 < 0x100) * cVar51 - (0xff < uVar332);
  dst[0x3f] = (uVar333 != 0) * (uVar333 < 0x100) * cVar52 - (0xff < uVar333);
  dst[0x40] = (uVar278 != 0) * (uVar278 < 0x100) * bVar49 - (0xff < uVar278);
  dst[0x41] = (uVar291 != 0) * (uVar291 < 0x100) * cVar64 - (0xff < uVar291);
  dst[0x42] = (uVar292 != 0) * (uVar292 < 0x100) * cVar53 - (0xff < uVar292);
  dst[0x43] = (uVar293 != 0) * (uVar293 < 0x100) * cVar63 - (0xff < uVar293);
  dst[0x44] = (uVar294 != 0) * (uVar294 < 0x100) * cVar62 - (0xff < uVar294);
  dst[0x45] = (uVar295 != 0) * (uVar295 < 0x100) * cVar56 - (0xff < uVar295);
  dst[0x46] = (uVar296 != 0) * (uVar296 < 0x100) * cVar55 - (0xff < uVar296);
  dst[0x47] = (uVar297 != 0) * (uVar297 < 0x100) * cVar54 - (0xff < uVar297);
  dst[0x48] = (uVar343 != 0) * (uVar343 < 0x100) * bVar57 - (0xff < uVar343);
  dst[0x49] = (uVar347 != 0) * (uVar347 < 0x100) * cVar14 - (0xff < uVar347);
  dst[0x4a] = (uVar348 != 0) * (uVar348 < 0x100) * cVar13 - (0xff < uVar348);
  dst[0x4b] = (uVar349 != 0) * (uVar349 < 0x100) * cVar12 - (0xff < uVar349);
  dst[0x4c] = (uVar350 != 0) * (uVar350 < 0x100) * cVar11 - (0xff < uVar350);
  dst[0x4d] = (uVar351 != 0) * (uVar351 < 0x100) * cVar10 - (0xff < uVar351);
  dst[0x4e] = (uVar352 != 0) * (uVar352 < 0x100) * cVar18 - (0xff < uVar352);
  dst[0x4f] = (uVar353 != 0) * (uVar353 < 0x100) * cVar19 - (0xff < uVar353);
  dst[0x50] = (uVar229 != 0) * (uVar229 < 0x100) * bVar1 - (0xff < uVar229);
  dst[0x51] = (uVar238 != 0) * (uVar238 < 0x100) * cVar61 - (0xff < uVar238);
  dst[0x52] = (uVar239 != 0) * (uVar239 < 0x100) * cVar60 - (0xff < uVar239);
  dst[0x53] = (uVar240 != 0) * (uVar240 < 0x100) * cVar20 - (0xff < uVar240);
  dst[0x54] = (uVar241 != 0) * (uVar241 < 0x100) * cVar31 - (0xff < uVar241);
  dst[0x55] = (uVar242 != 0) * (uVar242 < 0x100) * cVar23 - (0xff < uVar242);
  dst[0x56] = (uVar243 != 0) * (uVar243 < 0x100) * cVar22 - (0xff < uVar243);
  dst[0x57] = (uVar244 != 0) * (uVar244 < 0x100) * cVar21 - (0xff < uVar244);
  dst[0x58] = (uVar258 != 0) * (uVar258 < 0x100) * bVar9 - (0xff < uVar258);
  dst[0x59] = (uVar271 != 0) * (uVar271 < 0x100) * cVar24 - (0xff < uVar271);
  dst[0x5a] = (uVar272 != 0) * (uVar272 < 0x100) * cVar32 - (0xff < uVar272);
  dst[0x5b] = (uVar273 != 0) * (uVar273 < 0x100) * cVar30 - (0xff < uVar273);
  dst[0x5c] = (uVar274 != 0) * (uVar274 < 0x100) * cVar28 - (0xff < uVar274);
  dst[0x5d] = (uVar275 != 0) * (uVar275 < 0x100) * cVar3 - (0xff < uVar275);
  dst[0x5e] = (uVar276 != 0) * (uVar276 < 0x100) * cVar5 - (0xff < uVar276);
  dst[0x5f] = (uVar277 != 0) * (uVar277 < 0x100) * cVar4 - (0xff < uVar277);
  return;
}

Assistant:

void VP8YuvToRgb32_SSE2(const uint8_t* WEBP_RESTRICT y,
                        const uint8_t* WEBP_RESTRICT u,
                        const uint8_t* WEBP_RESTRICT v,
                        uint8_t* WEBP_RESTRICT dst) {
  __m128i R0, R1, R2, R3, G0, G1, G2, G3, B0, B1, B2, B3;
  __m128i rgb0, rgb1, rgb2, rgb3, rgb4, rgb5;

  YUV444ToRGB_SSE2(y + 0, u + 0, v + 0, &R0, &G0, &B0);
  YUV444ToRGB_SSE2(y + 8, u + 8, v + 8, &R1, &G1, &B1);
  YUV444ToRGB_SSE2(y + 16, u + 16, v + 16, &R2, &G2, &B2);
  YUV444ToRGB_SSE2(y + 24, u + 24, v + 24, &R3, &G3, &B3);

  // Cast to 8b and store as RRRRGGGGBBBB.
  rgb0 = _mm_packus_epi16(R0, R1);
  rgb1 = _mm_packus_epi16(R2, R3);
  rgb2 = _mm_packus_epi16(G0, G1);
  rgb3 = _mm_packus_epi16(G2, G3);
  rgb4 = _mm_packus_epi16(B0, B1);
  rgb5 = _mm_packus_epi16(B2, B3);

  // Pack as RGBRGBRGBRGB.
  PlanarTo24b_SSE2(&rgb0, &rgb1, &rgb2, &rgb3, &rgb4, &rgb5, dst);
}